

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersectorK<8,4>::
     intersect_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Primitive PVar4;
  undefined4 uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  bool bVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [12];
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  long lVar92;
  ulong uVar93;
  long lVar94;
  undefined1 auVar95 [8];
  uint uVar96;
  undefined4 uVar97;
  float fVar101;
  float fVar129;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ulong uVar98;
  bool bVar99;
  float fVar100;
  float fVar128;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar130;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar131;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar153 [32];
  float fVar165;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar142 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar152 [16];
  undefined1 auVar162 [32];
  undefined8 uVar169;
  undefined1 auVar170 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar177 [32];
  undefined1 auVar171 [16];
  float fVar184;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar188 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  float fVar225;
  float fVar226;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [28];
  float fVar228;
  float fVar229;
  undefined1 auVar221 [32];
  float fVar227;
  float fVar230;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar219 [16];
  undefined1 auVar224 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  float fVar258;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [64];
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 in_ZMM10 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar295;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar296 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined8 local_b00;
  undefined8 uStack_af8;
  float local_ae8;
  float local_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 auStack_ab0 [16];
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined8 *local_9b0;
  ulong local_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [48];
  undefined8 local_890;
  undefined8 uStack_888;
  undefined1 local_880 [16];
  Primitive *local_870;
  ulong local_868;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 auStack_7b0 [8];
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  RTCHitN local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  uint local_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint uStack_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar270 [16];
  undefined1 auVar297 [32];
  
  PVar4 = prim[1];
  uVar98 = (ulong)(byte)PVar4;
  lVar94 = uVar98 * 0x25;
  auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar197 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar216 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar216 = vinsertps_avx(auVar216,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar100 = *(float *)(prim + lVar94 + 0x12);
  auVar197 = vsubps_avx(auVar197,*(undefined1 (*) [16])(prim + lVar94 + 6));
  auVar102._0_4_ = fVar100 * auVar197._0_4_;
  auVar102._4_4_ = fVar100 * auVar197._4_4_;
  auVar102._8_4_ = fVar100 * auVar197._8_4_;
  auVar102._12_4_ = fVar100 * auVar197._12_4_;
  auVar170._0_4_ = fVar100 * auVar216._0_4_;
  auVar170._4_4_ = fVar100 * auVar216._4_4_;
  auVar170._8_4_ = fVar100 * auVar216._8_4_;
  auVar170._12_4_ = fVar100 * auVar216._12_4_;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar98 * 4 + 6);
  auVar153 = vpmovsxbd_avx2(auVar197);
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar98 * 5 + 6);
  auVar111 = vpmovsxbd_avx2(auVar216);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar98 * 6 + 6);
  auVar114 = vpmovsxbd_avx2(auVar173);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar98 * 0xf + 6);
  auVar180 = vpmovsxbd_avx2(auVar108);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar13 = vpmovsxbd_avx2(auVar282);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar98 + 6);
  auVar210 = vpmovsxbd_avx2(auVar2);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar98 * 0x1a + 6);
  auVar14 = vpmovsxbd_avx2(auVar139);
  auVar210 = vcvtdq2ps_avx(auVar210);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar98 * 0x1b + 6);
  auVar207 = vpmovsxbd_avx2(auVar149);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar98 * 0x1c + 6);
  auVar15 = vpmovsxbd_avx2(auVar3);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar261._4_4_ = auVar170._0_4_;
  auVar261._0_4_ = auVar170._0_4_;
  auVar261._8_4_ = auVar170._0_4_;
  auVar261._12_4_ = auVar170._0_4_;
  auVar261._16_4_ = auVar170._0_4_;
  auVar261._20_4_ = auVar170._0_4_;
  auVar261._24_4_ = auVar170._0_4_;
  auVar261._28_4_ = auVar170._0_4_;
  auVar197 = vmovshdup_avx(auVar170);
  uVar169 = auVar197._0_8_;
  auVar296._8_8_ = uVar169;
  auVar296._0_8_ = uVar169;
  auVar296._16_8_ = uVar169;
  auVar296._24_8_ = uVar169;
  auVar197 = vshufps_avx(auVar170,auVar170,0xaa);
  fVar100 = auVar197._0_4_;
  auVar213._0_4_ = fVar100 * auVar114._0_4_;
  fVar131 = auVar197._4_4_;
  auVar213._4_4_ = fVar131 * auVar114._4_4_;
  auVar213._8_4_ = fVar100 * auVar114._8_4_;
  auVar213._12_4_ = fVar131 * auVar114._12_4_;
  auVar213._16_4_ = fVar100 * auVar114._16_4_;
  auVar213._20_4_ = fVar131 * auVar114._20_4_;
  auVar213._28_36_ = in_ZMM11._28_36_;
  auVar213._24_4_ = fVar100 * auVar114._24_4_;
  auVar299._0_4_ = auVar210._0_4_ * fVar100;
  auVar299._4_4_ = auVar210._4_4_ * fVar131;
  auVar299._8_4_ = auVar210._8_4_ * fVar100;
  auVar299._12_4_ = auVar210._12_4_ * fVar131;
  auVar299._16_4_ = auVar210._16_4_ * fVar100;
  auVar299._20_4_ = auVar210._20_4_ * fVar131;
  auVar299._28_36_ = in_ZMM10._28_36_;
  auVar299._24_4_ = auVar210._24_4_ * fVar100;
  auVar268._0_4_ = auVar15._0_4_ * fVar100;
  auVar268._4_4_ = auVar15._4_4_ * fVar131;
  auVar268._8_4_ = auVar15._8_4_ * fVar100;
  auVar268._12_4_ = auVar15._12_4_ * fVar131;
  auVar268._16_4_ = auVar15._16_4_ * fVar100;
  auVar268._20_4_ = auVar15._20_4_ * fVar131;
  auVar268._24_4_ = auVar15._24_4_ * fVar100;
  auVar268._28_4_ = 0;
  auVar197 = vfmadd231ps_fma(auVar213._0_32_,auVar296,auVar111);
  auVar216 = vfmadd231ps_fma(auVar299._0_32_,auVar296,auVar13);
  auVar173 = vfmadd231ps_fma(auVar268,auVar207,auVar296);
  auVar108 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar261,auVar153);
  auVar216 = vfmadd231ps_fma(ZEXT1632(auVar216),auVar261,auVar180);
  auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar14,auVar261);
  auVar262._4_4_ = auVar102._0_4_;
  auVar262._0_4_ = auVar102._0_4_;
  auVar262._8_4_ = auVar102._0_4_;
  auVar262._12_4_ = auVar102._0_4_;
  auVar262._16_4_ = auVar102._0_4_;
  auVar262._20_4_ = auVar102._0_4_;
  auVar262._24_4_ = auVar102._0_4_;
  auVar262._28_4_ = auVar102._0_4_;
  auVar197 = vmovshdup_avx(auVar102);
  uVar169 = auVar197._0_8_;
  auVar297._8_8_ = uVar169;
  auVar297._0_8_ = uVar169;
  auVar297._16_8_ = uVar169;
  auVar297._24_8_ = uVar169;
  auVar299 = ZEXT3264(auVar297);
  auVar197 = vshufps_avx(auVar102,auVar102,0xaa);
  fVar100 = auVar197._0_4_;
  auVar115._0_4_ = fVar100 * auVar114._0_4_;
  fVar131 = auVar197._4_4_;
  auVar115._4_4_ = fVar131 * auVar114._4_4_;
  auVar115._8_4_ = fVar100 * auVar114._8_4_;
  auVar115._12_4_ = fVar131 * auVar114._12_4_;
  auVar115._16_4_ = fVar100 * auVar114._16_4_;
  auVar115._20_4_ = fVar131 * auVar114._20_4_;
  auVar115._24_4_ = fVar100 * auVar114._24_4_;
  auVar115._28_4_ = 0;
  auVar16._4_4_ = auVar210._4_4_ * fVar131;
  auVar16._0_4_ = auVar210._0_4_ * fVar100;
  auVar16._8_4_ = auVar210._8_4_ * fVar100;
  auVar16._12_4_ = auVar210._12_4_ * fVar131;
  auVar16._16_4_ = auVar210._16_4_ * fVar100;
  auVar16._20_4_ = auVar210._20_4_ * fVar131;
  auVar16._24_4_ = auVar210._24_4_ * fVar100;
  auVar16._28_4_ = auVar114._28_4_;
  auVar114._4_4_ = auVar15._4_4_ * fVar131;
  auVar114._0_4_ = auVar15._0_4_ * fVar100;
  auVar114._8_4_ = auVar15._8_4_ * fVar100;
  auVar114._12_4_ = auVar15._12_4_ * fVar131;
  auVar114._16_4_ = auVar15._16_4_ * fVar100;
  auVar114._20_4_ = auVar15._20_4_ * fVar131;
  auVar114._24_4_ = auVar15._24_4_ * fVar100;
  auVar114._28_4_ = fVar131;
  auVar197 = vfmadd231ps_fma(auVar115,auVar297,auVar111);
  auVar282 = vfmadd231ps_fma(auVar16,auVar297,auVar13);
  auVar2 = vfmadd231ps_fma(auVar114,auVar297,auVar207);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar262,auVar153);
  local_920._8_4_ = 0x7fffffff;
  local_920._0_8_ = 0x7fffffff7fffffff;
  local_920._12_4_ = 0x7fffffff;
  local_920._16_4_ = 0x7fffffff;
  local_920._20_4_ = 0x7fffffff;
  local_920._24_4_ = 0x7fffffff;
  local_920._28_4_ = 0x7fffffff;
  auVar283._8_4_ = 0x219392ef;
  auVar283._0_8_ = 0x219392ef219392ef;
  auVar283._12_4_ = 0x219392ef;
  auVar283._16_4_ = 0x219392ef;
  auVar283._20_4_ = 0x219392ef;
  auVar283._24_4_ = 0x219392ef;
  auVar283._28_4_ = 0x219392ef;
  auVar153 = vandps_avx(ZEXT1632(auVar108),local_920);
  auVar153 = vcmpps_avx(auVar153,auVar283,1);
  auVar111 = vblendvps_avx(ZEXT1632(auVar108),auVar283,auVar153);
  auVar153 = vandps_avx(ZEXT1632(auVar216),local_920);
  auVar153 = vcmpps_avx(auVar153,auVar283,1);
  auVar114 = vblendvps_avx(ZEXT1632(auVar216),auVar283,auVar153);
  auVar153 = vandps_avx(ZEXT1632(auVar173),local_920);
  auVar153 = vcmpps_avx(auVar153,auVar283,1);
  auVar153 = vblendvps_avx(ZEXT1632(auVar173),auVar283,auVar153);
  auVar170 = vfmadd231ps_fma(ZEXT1632(auVar282),auVar262,auVar180);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar262,auVar14);
  fVar100 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar94 + 0x16)) *
            *(float *)(prim + lVar94 + 0x1a);
  auVar251._4_4_ = fVar100;
  auVar251._0_4_ = fVar100;
  auVar251._8_4_ = fVar100;
  auVar251._12_4_ = fVar100;
  auVar251._16_4_ = fVar100;
  auVar251._20_4_ = fVar100;
  auVar251._24_4_ = fVar100;
  auVar251._28_4_ = fVar100;
  auVar180 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 7 + 6));
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0xb + 6));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar180);
  auVar210 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 9 + 6));
  auVar108 = vfmadd213ps_fma(auVar13,auVar251,auVar180);
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0xd + 6));
  auVar180 = vcvtdq2ps_avx(auVar210);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar180);
  auVar282 = vfmadd213ps_fma(auVar13,auVar251,auVar180);
  auVar180 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x12 + 6));
  auVar180 = vcvtdq2ps_avx(auVar180);
  uVar91 = (ulong)(uint)((int)(uVar98 * 5) << 2);
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 2 + uVar91 + 6));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar180);
  auVar210 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 + 6));
  auVar2 = vfmadd213ps_fma(auVar13,auVar251,auVar180);
  auVar180 = vcvtdq2ps_avx(auVar210);
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x18 + 6));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar180);
  auVar139 = vfmadd213ps_fma(auVar13,auVar251,auVar180);
  auVar180 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x1d + 6));
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 + (ulong)(byte)PVar4 * 0x20 + 6));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar180);
  auVar149 = vfmadd213ps_fma(auVar13,auVar251,auVar180);
  auVar180 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar4 * 0x20 - uVar98) + 6))
  ;
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x23 + 6));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar180);
  auVar3 = vfmadd213ps_fma(auVar13,auVar251,auVar180);
  auVar180 = vrcpps_avx(auVar111);
  auVar278._8_4_ = 0x3f800000;
  auVar278._0_8_ = &DAT_3f8000003f800000;
  auVar278._12_4_ = 0x3f800000;
  auVar278._16_4_ = 0x3f800000;
  auVar278._20_4_ = 0x3f800000;
  auVar278._24_4_ = 0x3f800000;
  auVar278._28_4_ = 0x3f800000;
  auVar197 = vfnmadd213ps_fma(auVar111,auVar180,auVar278);
  auVar197 = vfmadd132ps_fma(ZEXT1632(auVar197),auVar180,auVar180);
  auVar111 = vrcpps_avx(auVar114);
  auVar216 = vfnmadd213ps_fma(auVar114,auVar111,auVar278);
  auVar216 = vfmadd132ps_fma(ZEXT1632(auVar216),auVar111,auVar111);
  auVar111 = vrcpps_avx(auVar153);
  auVar173 = vfnmadd213ps_fma(auVar153,auVar111,auVar278);
  auVar173 = vfmadd132ps_fma(ZEXT1632(auVar173),auVar111,auVar111);
  auVar153 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar102));
  auVar111 = vsubps_avx(ZEXT1632(auVar282),ZEXT1632(auVar102));
  auVar180._4_4_ = auVar197._4_4_ * auVar153._4_4_;
  auVar180._0_4_ = auVar197._0_4_ * auVar153._0_4_;
  auVar180._8_4_ = auVar197._8_4_ * auVar153._8_4_;
  auVar180._12_4_ = auVar197._12_4_ * auVar153._12_4_;
  auVar180._16_4_ = auVar153._16_4_ * 0.0;
  auVar180._20_4_ = auVar153._20_4_ * 0.0;
  auVar180._24_4_ = auVar153._24_4_ * 0.0;
  auVar180._28_4_ = auVar153._28_4_;
  auVar13._4_4_ = auVar197._4_4_ * auVar111._4_4_;
  auVar13._0_4_ = auVar197._0_4_ * auVar111._0_4_;
  auVar13._8_4_ = auVar197._8_4_ * auVar111._8_4_;
  auVar13._12_4_ = auVar197._12_4_ * auVar111._12_4_;
  auVar13._16_4_ = auVar111._16_4_ * 0.0;
  auVar13._20_4_ = auVar111._20_4_ * 0.0;
  auVar13._24_4_ = auVar111._24_4_ * 0.0;
  auVar13._28_4_ = auVar111._28_4_;
  auVar153 = vsubps_avx(ZEXT1632(auVar2),ZEXT1632(auVar170));
  auVar111 = vsubps_avx(ZEXT1632(auVar139),ZEXT1632(auVar170));
  auVar210._4_4_ = auVar216._4_4_ * auVar153._4_4_;
  auVar210._0_4_ = auVar216._0_4_ * auVar153._0_4_;
  auVar210._8_4_ = auVar216._8_4_ * auVar153._8_4_;
  auVar210._12_4_ = auVar216._12_4_ * auVar153._12_4_;
  auVar210._16_4_ = auVar153._16_4_ * 0.0;
  auVar210._20_4_ = auVar153._20_4_ * 0.0;
  auVar210._24_4_ = auVar153._24_4_ * 0.0;
  auVar210._28_4_ = auVar153._28_4_;
  auVar14._4_4_ = auVar216._4_4_ * auVar111._4_4_;
  auVar14._0_4_ = auVar216._0_4_ * auVar111._0_4_;
  auVar14._8_4_ = auVar216._8_4_ * auVar111._8_4_;
  auVar14._12_4_ = auVar216._12_4_ * auVar111._12_4_;
  auVar14._16_4_ = auVar111._16_4_ * 0.0;
  auVar14._20_4_ = auVar111._20_4_ * 0.0;
  auVar14._24_4_ = auVar111._24_4_ * 0.0;
  auVar14._28_4_ = auVar111._28_4_;
  auVar153 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar103));
  auVar207._4_4_ = auVar173._4_4_ * auVar153._4_4_;
  auVar207._0_4_ = auVar173._0_4_ * auVar153._0_4_;
  auVar207._8_4_ = auVar173._8_4_ * auVar153._8_4_;
  auVar207._12_4_ = auVar173._12_4_ * auVar153._12_4_;
  auVar207._16_4_ = auVar153._16_4_ * 0.0;
  auVar207._20_4_ = auVar153._20_4_ * 0.0;
  auVar207._24_4_ = auVar153._24_4_ * 0.0;
  auVar207._28_4_ = auVar153._28_4_;
  auVar153 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar103));
  auVar15._4_4_ = auVar173._4_4_ * auVar153._4_4_;
  auVar15._0_4_ = auVar173._0_4_ * auVar153._0_4_;
  auVar15._8_4_ = auVar173._8_4_ * auVar153._8_4_;
  auVar15._12_4_ = auVar173._12_4_ * auVar153._12_4_;
  auVar15._16_4_ = auVar153._16_4_ * 0.0;
  auVar15._20_4_ = auVar153._20_4_ * 0.0;
  auVar15._24_4_ = auVar153._24_4_ * 0.0;
  auVar15._28_4_ = auVar153._28_4_;
  auVar153 = vpminsd_avx2(auVar180,auVar13);
  auVar111 = vpminsd_avx2(auVar210,auVar14);
  auVar153 = vmaxps_avx(auVar153,auVar111);
  auVar111 = vpminsd_avx2(auVar207,auVar15);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar263._4_4_ = uVar97;
  auVar263._0_4_ = uVar97;
  auVar263._8_4_ = uVar97;
  auVar263._12_4_ = uVar97;
  auVar263._16_4_ = uVar97;
  auVar263._20_4_ = uVar97;
  auVar263._24_4_ = uVar97;
  auVar263._28_4_ = uVar97;
  auVar111 = vmaxps_avx(auVar111,auVar263);
  auVar153 = vmaxps_avx(auVar153,auVar111);
  local_3c0._4_4_ = auVar153._4_4_ * 0.99999964;
  local_3c0._0_4_ = auVar153._0_4_ * 0.99999964;
  local_3c0._8_4_ = auVar153._8_4_ * 0.99999964;
  local_3c0._12_4_ = auVar153._12_4_ * 0.99999964;
  local_3c0._16_4_ = auVar153._16_4_ * 0.99999964;
  local_3c0._20_4_ = auVar153._20_4_ * 0.99999964;
  local_3c0._24_4_ = auVar153._24_4_ * 0.99999964;
  local_3c0._28_4_ = auVar153._28_4_;
  auVar153 = vpmaxsd_avx2(auVar180,auVar13);
  auVar111 = vpmaxsd_avx2(auVar210,auVar14);
  auVar153 = vminps_avx(auVar153,auVar111);
  auVar111 = vpmaxsd_avx2(auVar207,auVar15);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar177._4_4_ = uVar97;
  auVar177._0_4_ = uVar97;
  auVar177._8_4_ = uVar97;
  auVar177._12_4_ = uVar97;
  auVar177._16_4_ = uVar97;
  auVar177._20_4_ = uVar97;
  auVar177._24_4_ = uVar97;
  auVar177._28_4_ = uVar97;
  auVar111 = vminps_avx(auVar111,auVar177);
  auVar153 = vminps_avx(auVar153,auVar111);
  auVar112._4_4_ = auVar153._4_4_ * 1.0000004;
  auVar112._0_4_ = auVar153._0_4_ * 1.0000004;
  auVar112._8_4_ = auVar153._8_4_ * 1.0000004;
  auVar112._12_4_ = auVar153._12_4_ * 1.0000004;
  auVar112._16_4_ = auVar153._16_4_ * 1.0000004;
  auVar112._20_4_ = auVar153._20_4_ * 1.0000004;
  auVar112._24_4_ = auVar153._24_4_ * 1.0000004;
  auVar112._28_4_ = auVar153._28_4_;
  auVar153._1_3_ = 0;
  auVar153[0] = PVar4;
  auVar153[4] = PVar4;
  auVar153._5_3_ = 0;
  auVar153[8] = PVar4;
  auVar153._9_3_ = 0;
  auVar153[0xc] = PVar4;
  auVar153._13_3_ = 0;
  auVar153[0x10] = PVar4;
  auVar153._17_3_ = 0;
  auVar153[0x14] = PVar4;
  auVar153._21_3_ = 0;
  auVar153[0x18] = PVar4;
  auVar153._25_3_ = 0;
  auVar153[0x1c] = PVar4;
  auVar153._29_3_ = 0;
  auVar111 = vpcmpgtd_avx2(auVar153,_DAT_0205a920);
  auVar153 = vcmpps_avx(local_3c0,auVar112,2);
  auVar153 = vandps_avx(auVar153,auVar111);
  uVar89 = vmovmskps_avx(auVar153);
  if (uVar89 == 0) {
    return;
  }
  uVar89 = uVar89 & 0xff;
  auVar111._16_16_ = mm_lookupmask_ps._240_16_;
  auVar111._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,0x80);
  local_9b0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_870 = prim;
LAB_019809d3:
  lVar94 = 0;
  local_868 = (ulong)uVar89;
  for (uVar98 = local_868; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
    lVar94 = lVar94 + 1;
  }
  uVar89 = *(uint *)(local_870 + 2);
  local_6e0 = *(uint *)(local_870 + lVar94 * 4 + 6);
  local_9a8 = (ulong)local_6e0;
  pGVar6 = (context->scene->geometries).items[uVar89].ptr;
  uVar98 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_9a8 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar100 = (pGVar6->time_range).lower;
  fVar100 = pGVar6->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar100) / ((pGVar6->time_range).upper - fVar100));
  auVar197 = vroundss_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),9);
  auVar197 = vminss_avx(auVar197,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar197 = vmaxss_avx(ZEXT816(0) << 0x20,auVar197);
  fVar100 = fVar100 - auVar197._0_4_;
  fVar131 = 1.0 - fVar100;
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar92 = (long)(int)auVar197._0_4_ * 0x38;
  lVar8 = *(long *)(_Var7 + 0x10 + lVar92);
  lVar9 = *(long *)(_Var7 + 0x38 + lVar92);
  lVar10 = *(long *)(_Var7 + 0x48 + lVar92);
  pfVar1 = (float *)(lVar9 + lVar10 * uVar98);
  auVar103._0_4_ = fVar100 * *pfVar1;
  auVar103._4_4_ = fVar100 * pfVar1[1];
  auVar103._8_4_ = fVar100 * pfVar1[2];
  auVar103._12_4_ = fVar100 * pfVar1[3];
  lVar94 = uVar98 + 1;
  pfVar1 = (float *)(lVar9 + lVar10 * lVar94);
  auVar132._0_4_ = fVar100 * *pfVar1;
  auVar132._4_4_ = fVar100 * pfVar1[1];
  auVar132._8_4_ = fVar100 * pfVar1[2];
  auVar132._12_4_ = fVar100 * pfVar1[3];
  p_Var11 = pGVar6[4].occlusionFilterN;
  auVar214._4_4_ = fVar131;
  auVar214._0_4_ = fVar131;
  auVar214._8_4_ = fVar131;
  auVar214._12_4_ = fVar131;
  auVar282 = vfmadd231ps_fma(auVar103,auVar214,
                             *(undefined1 (*) [16])(*(long *)(_Var7 + lVar92) + lVar8 * uVar98));
  auVar2 = vfmadd231ps_fma(auVar132,auVar214,
                           *(undefined1 (*) [16])(*(long *)(_Var7 + lVar92) + lVar8 * lVar94));
  pfVar1 = (float *)(*(long *)(p_Var11 + lVar92 + 0x38) +
                    uVar98 * *(long *)(p_Var11 + lVar92 + 0x48));
  auVar171._0_4_ = fVar100 * *pfVar1;
  auVar171._4_4_ = fVar100 * pfVar1[1];
  auVar171._8_4_ = fVar100 * pfVar1[2];
  auVar171._12_4_ = fVar100 * pfVar1[3];
  pfVar1 = (float *)(*(long *)(p_Var11 + lVar92 + 0x38) +
                    *(long *)(p_Var11 + lVar92 + 0x48) * lVar94);
  auVar188._0_4_ = fVar100 * *pfVar1;
  auVar188._4_4_ = fVar100 * pfVar1[1];
  auVar188._8_4_ = fVar100 * pfVar1[2];
  auVar188._12_4_ = fVar100 * pfVar1[3];
  auVar173 = vfmadd231ps_fma(auVar171,auVar214,
                             *(undefined1 (*) [16])
                              (*(long *)(p_Var11 + lVar92) +
                              *(long *)(p_Var11 + lVar92 + 0x10) * uVar98));
  auVar108 = vfmadd231ps_fma(auVar188,auVar214,
                             *(undefined1 (*) [16])
                              (*(long *)(p_Var11 + lVar92) +
                              *(long *)(p_Var11 + lVar92 + 0x10) * lVar94));
  auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar216 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar259._4_4_ = uVar97;
  auVar259._0_4_ = uVar97;
  auVar259._8_4_ = uVar97;
  auVar259._12_4_ = uVar97;
  fStack_7d0 = (float)uVar97;
  _local_7e0 = auVar259;
  fStack_7cc = (float)uVar97;
  fStack_7c8 = (float)uVar97;
  register0x0000141c = uVar97;
  auVar266 = ZEXT3264(_local_7e0);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar267._4_4_ = uVar97;
  auVar267._0_4_ = uVar97;
  auVar267._8_4_ = uVar97;
  auVar267._12_4_ = uVar97;
  fStack_810 = (float)uVar97;
  _local_820 = auVar267;
  fStack_80c = (float)uVar97;
  fStack_808 = (float)uVar97;
  register0x0000145c = uVar97;
  auVar269 = ZEXT3264(_local_820);
  auVar197 = vunpcklps_avx(auVar259,auVar267);
  fVar100 = *(float *)(ray + k * 4 + 0x60);
  auVar270._4_4_ = fVar100;
  auVar270._0_4_ = fVar100;
  auVar270._8_4_ = fVar100;
  auVar270._12_4_ = fVar100;
  fStack_830 = fVar100;
  _local_840 = auVar270;
  fStack_82c = fVar100;
  fStack_828 = fVar100;
  uStack_824 = fVar100;
  auVar271 = ZEXT3264(_local_840);
  local_930 = vinsertps_avx(auVar197,auVar270,0x28);
  auVar276 = ZEXT1664(local_930);
  auVar231._8_4_ = 0xbeaaaaab;
  auVar231._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar231._12_4_ = 0xbeaaaaab;
  auVar139 = vfnmadd213ps_fma(auVar173,auVar231,auVar282);
  auVar108 = vfmadd213ps_fma(auVar108,auVar231,auVar2);
  auVar232._0_4_ = (auVar2._0_4_ + auVar282._0_4_ + auVar139._0_4_ + auVar108._0_4_) * 0.25;
  auVar232._4_4_ = (auVar2._4_4_ + auVar282._4_4_ + auVar139._4_4_ + auVar108._4_4_) * 0.25;
  auVar232._8_4_ = (auVar2._8_4_ + auVar282._8_4_ + auVar139._8_4_ + auVar108._8_4_) * 0.25;
  auVar232._12_4_ = (auVar2._12_4_ + auVar282._12_4_ + auVar139._12_4_ + auVar108._12_4_) * 0.25;
  auVar197 = vsubps_avx(auVar232,auVar216);
  auVar197 = vdpps_avx(auVar197,local_930,0x7f);
  local_940 = vdpps_avx(local_930,local_930,0x7f);
  auVar173 = vrcpss_avx(local_940,local_940);
  auVar149 = vfnmadd213ss_fma(auVar173,local_940,ZEXT416(0x40000000));
  auVar257 = ZEXT1664(auVar149);
  local_3a0 = auVar197._0_4_ * auVar173._0_4_ * auVar149._0_4_;
  auVar243 = ZEXT464((uint)local_3a0);
  auVar244._4_4_ = local_3a0;
  auVar244._0_4_ = local_3a0;
  auVar244._8_4_ = local_3a0;
  auVar244._12_4_ = local_3a0;
  fStack_790 = local_3a0;
  _local_7a0 = auVar244;
  fStack_78c = local_3a0;
  fStack_788 = local_3a0;
  fStack_784 = local_3a0;
  auVar197 = vfmadd231ps_fma(auVar216,local_930,auVar244);
  auVar197 = vblendps_avx(auVar197,_DAT_01feba10,8);
  local_a60 = vsubps_avx(auVar282,auVar197);
  local_a70 = vsubps_avx(auVar108,auVar197);
  auVar213 = ZEXT1664(local_a70);
  local_a80 = vsubps_avx(auVar139,auVar197);
  _local_a90 = vsubps_avx(auVar2,auVar197);
  auVar197 = vmovshdup_avx(local_a60);
  local_1a0 = auVar197._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar197 = vshufps_avx(local_a60,local_a60,0xaa);
  local_1c0 = auVar197._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar197 = vshufps_avx(local_a60,local_a60,0xff);
  local_1e0 = auVar197._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar197 = vmovshdup_avx(local_a80);
  local_200 = auVar197._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar197 = vshufps_avx(local_a80,local_a80,0xaa);
  local_220 = auVar197._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar197 = vshufps_avx(local_a80,local_a80,0xff);
  local_240 = auVar197._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar197 = vmovshdup_avx(local_a70);
  local_460 = auVar197._0_4_;
  fStack_45c = auVar197._4_4_;
  auVar197 = vshufps_avx(local_a70,local_a70,0xaa);
  local_480 = auVar197._0_4_;
  fStack_47c = auVar197._4_4_;
  auVar197 = vshufps_avx(local_a70,local_a70,0xff);
  local_260 = auVar197._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar197 = vmovshdup_avx(_local_a90);
  local_280 = auVar197._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar197 = vshufps_avx(_local_a90,_local_a90,0xaa);
  local_2a0 = auVar197._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar197 = vshufps_avx(_local_a90,_local_a90,0xff);
  local_2c0 = auVar197._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar197 = vfmadd231ps_fma(ZEXT432((uint)(fVar100 * fVar100)),_local_820,_local_820);
  auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),_local_7e0,_local_7e0);
  uVar97 = auVar197._0_4_;
  local_2e0._4_4_ = uVar97;
  local_2e0._0_4_ = uVar97;
  local_2e0._8_4_ = uVar97;
  local_2e0._12_4_ = uVar97;
  local_2e0._16_4_ = uVar97;
  local_2e0._20_4_ = uVar97;
  local_2e0._24_4_ = uVar97;
  local_2e0._28_4_ = uVar97;
  fVar100 = *(float *)(ray + k * 4 + 0x30);
  local_880 = ZEXT416((uint)local_3a0);
  local_3a0 = fVar100 - local_3a0;
  fStack_39c = local_3a0;
  fStack_398 = local_3a0;
  fStack_394 = local_3a0;
  fStack_390 = local_3a0;
  fStack_38c = local_3a0;
  fStack_388 = local_3a0;
  fStack_384 = local_3a0;
  uVar91 = 0;
  uVar98 = 1;
  local_300 = local_a60._0_4_;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  local_320 = local_a80._0_4_;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_340 = local_a70._0_4_;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  local_360 = local_a90._0_4_;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_4a0 = vandps_avx(local_2e0,local_920);
  auVar197 = vsqrtss_avx(local_940,local_940);
  local_ae4 = auVar197._0_4_;
  auVar197 = vsqrtss_avx(local_940,local_940);
  local_ae8 = auVar197._0_4_;
  local_890 = 0x3f80000000000000;
  uStack_888 = 0;
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = &DAT_3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar221._16_4_ = 0x3f800000;
  auVar221._20_4_ = 0x3f800000;
  auVar221._24_4_ = 0x3f800000;
  auVar221._28_4_ = 0x3f800000;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  local_6d0 = uVar89;
  uStack_6cc = uVar89;
  uStack_6c8 = uVar89;
  uStack_6c4 = uVar89;
  fStack_478 = local_480;
  fStack_474 = fStack_47c;
  fStack_470 = local_480;
  fStack_46c = fStack_47c;
  fStack_468 = local_480;
  fStack_464 = fStack_47c;
  fStack_458 = local_460;
  fStack_454 = fStack_45c;
  fStack_450 = local_460;
  fStack_44c = fStack_45c;
  fStack_448 = local_460;
  fStack_444 = fStack_45c;
  do {
    auVar74._8_8_ = uStack_888;
    auVar74._0_8_ = local_890;
    auVar197 = vmovshdup_avx(auVar74);
    local_720._0_4_ = (float)local_890;
    fVar131 = auVar197._0_4_ - local_720._0_4_;
    fVar168 = fVar131 * 0.04761905;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    local_900._4_4_ = fVar131;
    local_900._0_4_ = fVar131;
    local_900._8_4_ = fVar131;
    local_900._12_4_ = fVar131;
    local_900._16_4_ = fVar131;
    local_900._20_4_ = fVar131;
    local_900._24_4_ = fVar131;
    local_900._28_4_ = fVar131;
    auVar197 = vfmadd231ps_fma(local_720,local_900,_DAT_02020f20);
    auVar153 = vsubps_avx(auVar221,ZEXT1632(auVar197));
    auVar80._4_4_ = fStack_31c;
    auVar80._0_4_ = local_320;
    auVar80._8_4_ = fStack_318;
    auVar80._12_4_ = fStack_314;
    auVar80._16_4_ = fStack_310;
    auVar80._20_4_ = fStack_30c;
    auVar80._24_4_ = fStack_308;
    auVar80._28_4_ = fStack_304;
    fVar131 = auVar197._0_4_;
    auVar277._0_4_ = local_320 * fVar131;
    fVar101 = auVar197._4_4_;
    auVar277._4_4_ = fStack_31c * fVar101;
    fVar163 = auVar197._8_4_;
    auVar277._8_4_ = fStack_318 * fVar163;
    fVar128 = auVar197._12_4_;
    auVar277._12_4_ = fStack_314 * fVar128;
    auVar277._16_4_ = fStack_310 * 0.0;
    auVar277._20_4_ = fStack_30c * 0.0;
    auVar277._28_36_ = auVar276._28_36_;
    auVar277._24_4_ = fStack_308 * 0.0;
    auVar85._8_8_ = uStack_1f8;
    auVar85._0_8_ = local_200;
    auVar85._16_8_ = uStack_1f0;
    auVar85._24_8_ = uStack_1e8;
    auVar272._0_4_ = (float)local_200 * fVar131;
    auVar272._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar101;
    auVar272._8_4_ = (float)uStack_1f8 * fVar163;
    auVar272._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar128;
    auVar272._16_4_ = (float)uStack_1f0 * 0.0;
    auVar272._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar272._28_36_ = auVar271._28_36_;
    auVar272._24_4_ = (float)uStack_1e8 * 0.0;
    auVar84._8_8_ = uStack_218;
    auVar84._0_8_ = local_220;
    auVar84._16_8_ = uStack_210;
    auVar84._24_8_ = uStack_208;
    auVar276._0_4_ = (float)local_220 * fVar131;
    auVar276._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar101;
    auVar276._8_4_ = (float)uStack_218 * fVar163;
    auVar276._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar128;
    auVar276._16_4_ = (float)uStack_210 * 0.0;
    auVar276._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar276._28_36_ = auVar269._28_36_;
    auVar276._24_4_ = (float)uStack_208 * 0.0;
    auVar83._8_8_ = uStack_238;
    auVar83._0_8_ = local_240;
    auVar83._16_8_ = uStack_230;
    auVar83._24_8_ = uStack_228;
    auVar269._0_4_ = (float)local_240 * fVar131;
    auVar269._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar101;
    auVar269._8_4_ = (float)uStack_238 * fVar163;
    auVar269._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar128;
    auVar269._16_4_ = (float)uStack_230 * 0.0;
    auVar269._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar269._28_36_ = auVar257._28_36_;
    auVar269._24_4_ = (float)uStack_228 * 0.0;
    auVar81._4_4_ = uStack_2fc;
    auVar81._0_4_ = local_300;
    auVar81._8_4_ = uStack_2f8;
    auVar81._12_4_ = uStack_2f4;
    auVar81._16_4_ = uStack_2f0;
    auVar81._20_4_ = uStack_2ec;
    auVar81._24_4_ = uStack_2e8;
    auVar81._28_4_ = uStack_2e4;
    auVar197 = vfmadd231ps_fma(auVar277._0_32_,auVar153,auVar81);
    auVar88._8_8_ = uStack_198;
    auVar88._0_8_ = local_1a0;
    auVar88._16_8_ = uStack_190;
    auVar88._24_8_ = uStack_188;
    auVar216 = vfmadd231ps_fma(auVar272._0_32_,auVar153,auVar88);
    auVar87._8_8_ = uStack_1b8;
    auVar87._0_8_ = local_1c0;
    auVar87._16_8_ = uStack_1b0;
    auVar87._24_8_ = uStack_1a8;
    auVar173 = vfmadd231ps_fma(auVar276._0_32_,auVar153,auVar87);
    auVar86._8_8_ = uStack_1d8;
    auVar86._0_8_ = local_1e0;
    auVar86._16_8_ = uStack_1d0;
    auVar86._24_8_ = uStack_1c8;
    auVar108 = vfmadd231ps_fma(auVar269._0_32_,auVar153,auVar86);
    auVar79._4_4_ = fStack_33c;
    auVar79._0_4_ = local_340;
    auVar79._8_4_ = fStack_338;
    auVar79._12_4_ = fStack_334;
    auVar79._16_4_ = fStack_330;
    auVar79._20_4_ = fStack_32c;
    auVar79._24_4_ = fStack_328;
    auVar79._28_4_ = fStack_324;
    auVar271._0_4_ = local_340 * fVar131;
    auVar271._4_4_ = fStack_33c * fVar101;
    auVar271._8_4_ = fStack_338 * fVar163;
    auVar271._12_4_ = fStack_334 * fVar128;
    auVar271._16_4_ = fStack_330 * 0.0;
    auVar271._20_4_ = fStack_32c * 0.0;
    auVar271._28_36_ = auVar266._28_36_;
    auVar271._24_4_ = fStack_328 * 0.0;
    auVar257._0_4_ = fVar131 * local_460;
    auVar257._4_4_ = fVar101 * fStack_45c;
    auVar257._8_4_ = fVar163 * fStack_458;
    auVar257._12_4_ = fVar128 * fStack_454;
    auVar257._16_4_ = fStack_450 * 0.0;
    auVar257._20_4_ = fStack_44c * 0.0;
    auVar257._28_36_ = auVar243._28_36_;
    auVar257._24_4_ = fStack_448 * 0.0;
    auVar243._0_4_ = fVar131 * local_480;
    auVar243._4_4_ = fVar101 * fStack_47c;
    auVar243._8_4_ = fVar163 * fStack_478;
    auVar243._12_4_ = fVar128 * fStack_474;
    auVar243._16_4_ = fStack_470 * 0.0;
    auVar243._20_4_ = fStack_46c * 0.0;
    auVar243._28_36_ = auVar213._28_36_;
    auVar243._24_4_ = fStack_468 * 0.0;
    auVar82._8_8_ = uStack_258;
    auVar82._0_8_ = local_260;
    auVar82._16_8_ = uStack_250;
    auVar82._24_8_ = uStack_248;
    auVar266._0_4_ = (float)local_260 * fVar131;
    auVar266._4_4_ = (float)((ulong)local_260 >> 0x20) * fVar101;
    auVar266._8_4_ = (float)uStack_258 * fVar163;
    auVar266._12_4_ = (float)((ulong)uStack_258 >> 0x20) * fVar128;
    auVar266._16_4_ = (float)uStack_250 * 0.0;
    auVar266._20_4_ = (float)((ulong)uStack_250 >> 0x20) * 0.0;
    auVar266._28_36_ = auVar299._28_36_;
    auVar266._24_4_ = (float)uStack_248 * 0.0;
    auVar282 = vfmadd231ps_fma(auVar271._0_32_,auVar153,auVar80);
    auVar2 = vfmadd231ps_fma(auVar257._0_32_,auVar153,auVar85);
    auVar139 = vfmadd231ps_fma(auVar243._0_32_,auVar153,auVar84);
    auVar149 = vfmadd231ps_fma(auVar266._0_32_,auVar153,auVar83);
    auVar18._4_4_ = fVar101 * fStack_35c;
    auVar18._0_4_ = fVar131 * local_360;
    auVar18._8_4_ = fVar163 * fStack_358;
    auVar18._12_4_ = fVar128 * fStack_354;
    auVar18._16_4_ = fStack_350 * 0.0;
    auVar18._20_4_ = fStack_34c * 0.0;
    auVar18._24_4_ = fStack_348 * 0.0;
    auVar18._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar19._4_4_ = fVar101 * local_280._4_4_;
    auVar19._0_4_ = fVar131 * (float)local_280;
    auVar19._8_4_ = fVar163 * (float)uStack_278;
    auVar19._12_4_ = fVar128 * uStack_278._4_4_;
    auVar19._16_4_ = (float)uStack_270 * 0.0;
    auVar19._20_4_ = uStack_270._4_4_ * 0.0;
    auVar19._24_4_ = (float)uStack_268 * 0.0;
    auVar19._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar20._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar282._12_4_ * fVar128,
                            CONCAT48(auVar282._8_4_ * fVar163,
                                     CONCAT44(auVar282._4_4_ * fVar101,auVar282._0_4_ * fVar131))));
    auVar197 = vfmadd231ps_fma(auVar20,auVar153,ZEXT1632(auVar197));
    auVar216 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar2._12_4_,
                                                  CONCAT48(fVar163 * auVar2._8_4_,
                                                           CONCAT44(fVar101 * auVar2._4_4_,
                                                                    fVar131 * auVar2._0_4_)))),
                               auVar153,ZEXT1632(auVar216));
    auVar173 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar139._12_4_,
                                                  CONCAT48(fVar163 * auVar139._8_4_,
                                                           CONCAT44(fVar101 * auVar139._4_4_,
                                                                    fVar131 * auVar139._0_4_)))),
                               auVar153,ZEXT1632(auVar173));
    auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar149._12_4_ * fVar128,
                                                  CONCAT48(auVar149._8_4_ * fVar163,
                                                           CONCAT44(auVar149._4_4_ * fVar101,
                                                                    auVar149._0_4_ * fVar131)))),
                               auVar153,ZEXT1632(auVar108));
    auVar252._0_4_ = fVar131 * (float)local_2a0;
    auVar252._4_4_ = fVar101 * local_2a0._4_4_;
    auVar252._8_4_ = fVar163 * (float)uStack_298;
    auVar252._12_4_ = fVar128 * uStack_298._4_4_;
    auVar252._16_4_ = (float)uStack_290 * 0.0;
    auVar252._20_4_ = uStack_290._4_4_ * 0.0;
    auVar252._24_4_ = (float)uStack_288 * 0.0;
    auVar252._28_4_ = 0;
    auVar3 = vfmadd231ps_fma(auVar18,auVar153,auVar79);
    auVar282 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * fVar128,
                                                  CONCAT48(auVar3._8_4_ * fVar163,
                                                           CONCAT44(auVar3._4_4_ * fVar101,
                                                                    auVar3._0_4_ * fVar131)))),
                               auVar153,ZEXT1632(auVar282));
    auVar264._0_4_ = fVar131 * (float)local_2c0;
    auVar264._4_4_ = fVar101 * local_2c0._4_4_;
    auVar264._8_4_ = fVar163 * (float)uStack_2b8;
    auVar264._12_4_ = fVar128 * uStack_2b8._4_4_;
    auVar264._16_4_ = (float)uStack_2b0 * 0.0;
    auVar264._20_4_ = uStack_2b0._4_4_ * 0.0;
    auVar264._24_4_ = (float)uStack_2a8 * 0.0;
    auVar264._28_4_ = 0;
    auVar77._4_4_ = fStack_45c;
    auVar77._0_4_ = local_460;
    auVar77._8_4_ = fStack_458;
    auVar77._12_4_ = fStack_454;
    auVar77._16_4_ = fStack_450;
    auVar77._20_4_ = fStack_44c;
    auVar77._24_4_ = fStack_448;
    auVar77._28_4_ = fStack_444;
    auVar3 = vfmadd231ps_fma(auVar19,auVar153,auVar77);
    auVar76._4_4_ = fStack_47c;
    auVar76._0_4_ = local_480;
    auVar76._8_4_ = fStack_478;
    auVar76._12_4_ = fStack_474;
    auVar76._16_4_ = fStack_470;
    auVar76._20_4_ = fStack_46c;
    auVar76._24_4_ = fStack_468;
    auVar76._28_4_ = fStack_464;
    auVar102 = vfmadd231ps_fma(auVar252,auVar153,auVar76);
    auVar170 = vfmadd231ps_fma(auVar264,auVar153,auVar82);
    auVar21._28_4_ = fStack_324;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(auVar170._12_4_ * fVar128,
                            CONCAT48(auVar170._8_4_ * fVar163,
                                     CONCAT44(auVar170._4_4_ * fVar101,auVar170._0_4_ * fVar131))));
    auVar2 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * fVar128,
                                                CONCAT48(auVar3._8_4_ * fVar163,
                                                         CONCAT44(auVar3._4_4_ * fVar101,
                                                                  auVar3._0_4_ * fVar131)))),
                             auVar153,ZEXT1632(auVar2));
    auVar139 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar102._12_4_,
                                                  CONCAT48(fVar163 * auVar102._8_4_,
                                                           CONCAT44(fVar101 * auVar102._4_4_,
                                                                    fVar131 * auVar102._0_4_)))),
                               auVar153,ZEXT1632(auVar139));
    auVar149 = vfmadd231ps_fma(auVar21,auVar153,ZEXT1632(auVar149));
    auVar22._28_4_ = (int)((ulong)uStack_248 >> 0x20);
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(auVar2._12_4_ * fVar128,
                            CONCAT48(auVar2._8_4_ * fVar163,
                                     CONCAT44(auVar2._4_4_ * fVar101,auVar2._0_4_ * fVar131))));
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar282._12_4_ * fVar128,
                                                CONCAT48(auVar282._8_4_ * fVar163,
                                                         CONCAT44(auVar282._4_4_ * fVar101,
                                                                  auVar282._0_4_ * fVar131)))),
                             auVar153,ZEXT1632(auVar197));
    auVar102 = vfmadd231ps_fma(auVar22,auVar153,ZEXT1632(auVar216));
    auVar112 = ZEXT1632(auVar102);
    auVar102 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar139._12_4_,
                                                  CONCAT48(fVar163 * auVar139._8_4_,
                                                           CONCAT44(fVar101 * auVar139._4_4_,
                                                                    fVar131 * auVar139._0_4_)))),
                               auVar153,ZEXT1632(auVar173));
    auVar170 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar149._12_4_ * fVar128,
                                                  CONCAT48(auVar149._8_4_ * fVar163,
                                                           CONCAT44(auVar149._4_4_ * fVar101,
                                                                    auVar149._0_4_ * fVar131)))),
                               ZEXT1632(auVar108),auVar153);
    auVar111 = vsubps_avx(ZEXT1632(auVar282),ZEXT1632(auVar197));
    auVar153 = vsubps_avx(ZEXT1632(auVar2),ZEXT1632(auVar216));
    auVar114 = vsubps_avx(ZEXT1632(auVar139),ZEXT1632(auVar173));
    auVar180 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar108));
    local_9e0._0_4_ = fVar168 * auVar111._0_4_ * 3.0;
    local_9e0._4_4_ = fVar168 * auVar111._4_4_ * 3.0;
    local_9e0._8_4_ = fVar168 * auVar111._8_4_ * 3.0;
    local_9e0._12_4_ = fVar168 * auVar111._12_4_ * 3.0;
    local_9e0._16_4_ = fVar168 * auVar111._16_4_ * 3.0;
    local_9e0._20_4_ = fVar168 * auVar111._20_4_ * 3.0;
    local_9e0._24_4_ = fVar168 * auVar111._24_4_ * 3.0;
    local_9e0._28_4_ = 0;
    local_700._0_4_ = fVar168 * auVar153._0_4_ * 3.0;
    local_700._4_4_ = fVar168 * auVar153._4_4_ * 3.0;
    local_700._8_4_ = fVar168 * auVar153._8_4_ * 3.0;
    local_700._12_4_ = fVar168 * auVar153._12_4_ * 3.0;
    local_700._16_4_ = fVar168 * auVar153._16_4_ * 3.0;
    local_700._20_4_ = fVar168 * auVar153._20_4_ * 3.0;
    local_700._24_4_ = fVar168 * auVar153._24_4_ * 3.0;
    local_700._28_4_ = 0;
    local_a00._0_4_ = fVar168 * auVar114._0_4_ * 3.0;
    local_a00._4_4_ = fVar168 * auVar114._4_4_ * 3.0;
    local_a00._8_4_ = fVar168 * auVar114._8_4_ * 3.0;
    local_a00._12_4_ = fVar168 * auVar114._12_4_ * 3.0;
    local_a00._16_4_ = fVar168 * auVar114._16_4_ * 3.0;
    local_a00._20_4_ = fVar168 * auVar114._20_4_ * 3.0;
    local_a00._24_4_ = fVar168 * auVar114._24_4_ * 3.0;
    local_a00._28_4_ = 0;
    fVar131 = fVar168 * auVar180._0_4_ * 3.0;
    fVar163 = fVar168 * auVar180._4_4_ * 3.0;
    auVar23._4_4_ = fVar163;
    auVar23._0_4_ = fVar131;
    fVar164 = fVar168 * auVar180._8_4_ * 3.0;
    auVar23._8_4_ = fVar164;
    fVar165 = fVar168 * auVar180._12_4_ * 3.0;
    auVar23._12_4_ = fVar165;
    fVar166 = fVar168 * auVar180._16_4_ * 3.0;
    auVar23._16_4_ = fVar166;
    fVar167 = fVar168 * auVar180._20_4_ * 3.0;
    auVar23._20_4_ = fVar167;
    fVar168 = fVar168 * auVar180._24_4_ * 3.0;
    auVar23._24_4_ = fVar168;
    auVar23._28_4_ = auVar111._28_4_;
    auVar177 = ZEXT1632(auVar3);
    auVar207 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar3));
    auVar15 = vpermps_avx2(_DAT_0205d4a0,auVar112);
    local_8c0._0_32_ = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar102));
    local_520 = vsubps_avx(auVar207,auVar177);
    local_500 = vsubps_avx(local_8c0._0_32_,ZEXT1632(auVar102));
    fVar184 = local_500._0_4_;
    fVar185 = local_500._4_4_;
    auVar24._4_4_ = fVar185 * local_9e0._4_4_;
    auVar24._0_4_ = fVar184 * local_9e0._0_4_;
    fVar186 = local_500._8_4_;
    auVar24._8_4_ = fVar186 * local_9e0._8_4_;
    fVar187 = local_500._12_4_;
    auVar24._12_4_ = fVar187 * local_9e0._12_4_;
    fVar229 = local_500._16_4_;
    auVar24._16_4_ = fVar229 * local_9e0._16_4_;
    fVar230 = local_500._20_4_;
    auVar24._20_4_ = fVar230 * local_9e0._20_4_;
    fVar258 = local_500._24_4_;
    auVar24._24_4_ = fVar258 * local_9e0._24_4_;
    auVar24._28_4_ = local_8c0._28_4_;
    auVar197 = vfmsub231ps_fma(auVar24,local_a00,local_520);
    local_540 = vsubps_avx(auVar15,auVar112);
    fVar275 = local_520._0_4_;
    fVar289 = local_520._4_4_;
    auVar25._4_4_ = fVar289 * local_700._4_4_;
    auVar25._0_4_ = fVar275 * local_700._0_4_;
    fVar290 = local_520._8_4_;
    auVar25._8_4_ = fVar290 * local_700._8_4_;
    fVar291 = local_520._12_4_;
    auVar25._12_4_ = fVar291 * local_700._12_4_;
    fVar292 = local_520._16_4_;
    auVar25._16_4_ = fVar292 * local_700._16_4_;
    fVar293 = local_520._20_4_;
    auVar25._20_4_ = fVar293 * local_700._20_4_;
    fVar294 = local_520._24_4_;
    auVar25._24_4_ = fVar294 * local_700._24_4_;
    auVar25._28_4_ = auVar207._28_4_;
    auVar216 = vfmsub231ps_fma(auVar25,local_9e0,local_540);
    auVar197 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar216._12_4_ * auVar216._12_4_,
                                                  CONCAT48(auVar216._8_4_ * auVar216._8_4_,
                                                           CONCAT44(auVar216._4_4_ * auVar216._4_4_,
                                                                    auVar216._0_4_ * auVar216._0_4_)
                                                          ))),ZEXT1632(auVar197),ZEXT1632(auVar197))
    ;
    fVar302 = local_540._0_4_;
    fVar225 = local_540._4_4_;
    auVar26._4_4_ = fVar225 * local_a00._4_4_;
    auVar26._0_4_ = fVar302 * (float)local_a00._0_4_;
    fVar226 = local_540._8_4_;
    auVar26._8_4_ = fVar226 * local_a00._8_4_;
    fVar227 = local_540._12_4_;
    auVar26._12_4_ = fVar227 * local_a00._12_4_;
    fVar228 = local_540._16_4_;
    auVar26._16_4_ = fVar228 * local_a00._16_4_;
    fVar273 = local_540._20_4_;
    auVar26._20_4_ = fVar273 * local_a00._20_4_;
    fVar274 = local_540._24_4_;
    auVar26._24_4_ = fVar274 * local_a00._24_4_;
    auVar26._28_4_ = auVar15._28_4_;
    auVar173 = vfmsub231ps_fma(auVar26,local_700,local_500);
    auVar205._0_4_ = fVar184 * fVar184;
    auVar205._4_4_ = fVar185 * fVar185;
    auVar205._8_4_ = fVar186 * fVar186;
    auVar205._12_4_ = fVar187 * fVar187;
    auVar205._16_4_ = fVar229 * fVar229;
    auVar205._20_4_ = fVar230 * fVar230;
    auVar205._24_4_ = fVar258 * fVar258;
    auVar205._28_4_ = 0;
    auVar216 = vfmadd231ps_fma(auVar205,local_540,local_540);
    auVar216 = vfmadd231ps_fma(ZEXT1632(auVar216),local_520,local_520);
    auVar153 = vrcpps_avx(ZEXT1632(auVar216));
    auVar173 = vfmadd231ps_fma(ZEXT1632(auVar197),ZEXT1632(auVar173),ZEXT1632(auVar173));
    auVar279._8_4_ = 0x3f800000;
    auVar279._0_8_ = &DAT_3f8000003f800000;
    auVar279._12_4_ = 0x3f800000;
    auVar279._16_4_ = 0x3f800000;
    auVar279._20_4_ = 0x3f800000;
    auVar279._24_4_ = 0x3f800000;
    auVar279._28_4_ = 0x3f800000;
    auVar197 = vfnmadd213ps_fma(auVar153,ZEXT1632(auVar216),auVar279);
    auVar197 = vfmadd132ps_fma(ZEXT1632(auVar197),auVar153,auVar153);
    local_960 = vpermps_avx2(_DAT_0205d4a0,local_9e0);
    local_8e0 = vpermps_avx2(_DAT_0205d4a0,local_a00);
    auVar27._4_4_ = local_960._4_4_ * fVar185;
    auVar27._0_4_ = local_960._0_4_ * fVar184;
    auVar27._8_4_ = local_960._8_4_ * fVar186;
    auVar27._12_4_ = local_960._12_4_ * fVar187;
    auVar27._16_4_ = local_960._16_4_ * fVar229;
    auVar27._20_4_ = local_960._20_4_ * fVar230;
    auVar27._24_4_ = local_960._24_4_ * fVar258;
    auVar27._28_4_ = auVar153._28_4_;
    auVar108 = vfmsub231ps_fma(auVar27,local_8e0,local_520);
    local_a20 = vpermps_avx2(_DAT_0205d4a0,local_700);
    auVar28._4_4_ = fVar289 * local_a20._4_4_;
    auVar28._0_4_ = fVar275 * local_a20._0_4_;
    auVar28._8_4_ = fVar290 * local_a20._8_4_;
    auVar28._12_4_ = fVar291 * local_a20._12_4_;
    auVar28._16_4_ = fVar292 * local_a20._16_4_;
    auVar28._20_4_ = fVar293 * local_a20._20_4_;
    auVar28._24_4_ = fVar294 * local_a20._24_4_;
    auVar28._28_4_ = 0;
    auVar282 = vfmsub231ps_fma(auVar28,local_960,local_540);
    auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar282._12_4_ * auVar282._12_4_,
                                                  CONCAT48(auVar282._8_4_ * auVar282._8_4_,
                                                           CONCAT44(auVar282._4_4_ * auVar282._4_4_,
                                                                    auVar282._0_4_ * auVar282._0_4_)
                                                          ))),ZEXT1632(auVar108),ZEXT1632(auVar108))
    ;
    fVar101 = local_8e0._0_4_;
    auVar237._0_4_ = fVar302 * fVar101;
    fVar128 = local_8e0._4_4_;
    auVar237._4_4_ = fVar225 * fVar128;
    fVar129 = local_8e0._8_4_;
    auVar237._8_4_ = fVar226 * fVar129;
    fVar130 = local_8e0._12_4_;
    auVar237._12_4_ = fVar227 * fVar130;
    fVar295 = local_8e0._16_4_;
    auVar237._16_4_ = fVar228 * fVar295;
    fVar300 = local_8e0._20_4_;
    auVar237._20_4_ = fVar273 * fVar300;
    fVar301 = local_8e0._24_4_;
    auVar237._24_4_ = fVar274 * fVar301;
    auVar237._28_4_ = 0;
    auVar282 = vfmsub231ps_fma(auVar237,local_a20,local_500);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT1632(auVar282),ZEXT1632(auVar282));
    auVar153 = vmaxps_avx(ZEXT1632(CONCAT412(auVar173._12_4_ * auVar197._12_4_,
                                             CONCAT48(auVar173._8_4_ * auVar197._8_4_,
                                                      CONCAT44(auVar173._4_4_ * auVar197._4_4_,
                                                               auVar173._0_4_ * auVar197._0_4_)))),
                          ZEXT1632(CONCAT412(auVar108._12_4_ * auVar197._12_4_,
                                             CONCAT48(auVar108._8_4_ * auVar197._8_4_,
                                                      CONCAT44(auVar108._4_4_ * auVar197._4_4_,
                                                               auVar108._0_4_ * auVar197._0_4_)))));
    local_760._0_4_ = auVar170._0_4_ + fVar131;
    local_760._4_4_ = auVar170._4_4_ + fVar163;
    local_760._8_4_ = auVar170._8_4_ + fVar164;
    local_760._12_4_ = auVar170._12_4_ + fVar165;
    local_760._16_4_ = fVar166 + 0.0;
    local_760._20_4_ = fVar167 + 0.0;
    local_760._24_4_ = fVar168 + 0.0;
    local_760._28_4_ = auVar111._28_4_ + 0.0;
    local_740 = ZEXT1632(auVar170);
    auVar111 = vsubps_avx(local_740,auVar23);
    local_780 = vpermps_avx2(_DAT_0205d4a0,auVar111);
    auVar16 = vpermps_avx2(_DAT_0205d4a0,local_740);
    auVar111 = vmaxps_avx(local_740,local_760);
    auVar114 = vmaxps_avx(local_780,auVar16);
    auVar180 = vrsqrtps_avx(ZEXT1632(auVar216));
    auVar111 = vmaxps_avx(auVar111,auVar114);
    fVar131 = auVar180._0_4_;
    fVar163 = auVar180._4_4_;
    fVar168 = auVar180._8_4_;
    fVar164 = auVar180._12_4_;
    fVar165 = auVar180._16_4_;
    fVar166 = auVar180._20_4_;
    fVar167 = auVar180._24_4_;
    auVar29._4_4_ = fVar163 * fVar163 * fVar163 * auVar216._4_4_ * -0.5;
    auVar29._0_4_ = fVar131 * fVar131 * fVar131 * auVar216._0_4_ * -0.5;
    auVar29._8_4_ = fVar168 * fVar168 * fVar168 * auVar216._8_4_ * -0.5;
    auVar29._12_4_ = fVar164 * fVar164 * fVar164 * auVar216._12_4_ * -0.5;
    auVar29._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
    auVar29._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
    auVar29._24_4_ = fVar167 * fVar167 * fVar167 * -0.0;
    auVar29._28_4_ = local_a20._28_4_;
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar197 = vfmadd231ps_fma(auVar29,auVar113,auVar180);
    auVar269 = ZEXT1664(auVar197);
    fVar163 = auVar197._0_4_;
    fVar168 = auVar197._4_4_;
    auVar30._4_4_ = fVar225 * fVar168;
    auVar30._0_4_ = fVar302 * fVar163;
    fVar165 = auVar197._8_4_;
    auVar30._8_4_ = fVar226 * fVar165;
    fVar167 = auVar197._12_4_;
    auVar30._12_4_ = fVar227 * fVar167;
    auVar30._16_4_ = fVar228 * 0.0;
    auVar30._20_4_ = fVar273 * 0.0;
    auVar30._24_4_ = fVar274 * 0.0;
    auVar30._28_4_ = 0;
    auVar31._4_4_ = (float)local_840._4_4_ * fVar168 * fVar185;
    auVar31._0_4_ = (float)local_840._0_4_ * fVar163 * fVar184;
    auVar31._8_4_ = fStack_838 * fVar165 * fVar186;
    auVar31._12_4_ = fStack_834 * fVar167 * fVar187;
    auVar31._16_4_ = fStack_830 * fVar229 * 0.0;
    auVar31._20_4_ = fStack_82c * fVar230 * 0.0;
    auVar31._24_4_ = fStack_828 * fVar258 * 0.0;
    auVar31._28_4_ = local_540._28_4_;
    auVar197 = vfmadd231ps_fma(auVar31,auVar30,_local_820);
    _local_600 = ZEXT1632(auVar102);
    auVar114 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar13 = vsubps_avx(auVar114,_local_600);
    fVar302 = auVar13._0_4_;
    auVar284._0_4_ = fVar302 * fVar163 * fVar184;
    fVar225 = auVar13._4_4_;
    auVar284._4_4_ = fVar225 * fVar168 * fVar185;
    fVar226 = auVar13._8_4_;
    auVar284._8_4_ = fVar226 * fVar165 * fVar186;
    fVar227 = auVar13._12_4_;
    auVar284._12_4_ = fVar227 * fVar167 * fVar187;
    fVar228 = auVar13._16_4_;
    auVar284._16_4_ = fVar228 * fVar229 * 0.0;
    fVar229 = auVar13._20_4_;
    auVar284._20_4_ = fVar229 * fVar230 * 0.0;
    fVar230 = auVar13._24_4_;
    auVar284._24_4_ = fVar230 * fVar258 * 0.0;
    auVar284._28_4_ = 0;
    auVar210 = vsubps_avx(auVar114,auVar112);
    auVar216 = vfmadd231ps_fma(auVar284,auVar210,auVar30);
    auVar32._4_4_ = fVar289 * fVar168;
    auVar32._0_4_ = fVar275 * fVar163;
    auVar32._8_4_ = fVar290 * fVar165;
    auVar32._12_4_ = fVar291 * fVar167;
    auVar32._16_4_ = fVar292 * 0.0;
    auVar32._20_4_ = fVar293 * 0.0;
    auVar32._24_4_ = fVar294 * 0.0;
    auVar32._28_4_ = auVar180._28_4_;
    auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar32,_local_7e0);
    auVar271 = ZEXT1664(auVar197);
    auVar115 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar14 = vsubps_avx(auVar115,auVar177);
    auVar216 = vfmadd231ps_fma(ZEXT1632(auVar216),auVar14,auVar32);
    auVar33._4_4_ = (float)local_840._4_4_ * fVar225;
    auVar33._0_4_ = (float)local_840._0_4_ * fVar302;
    auVar33._8_4_ = fStack_838 * fVar226;
    auVar33._12_4_ = fStack_834 * fVar227;
    auVar33._16_4_ = fStack_830 * fVar228;
    auVar33._20_4_ = fStack_82c * fVar229;
    auVar33._24_4_ = fStack_828 * fVar230;
    auVar33._28_4_ = auVar180._28_4_;
    auVar173 = vfmadd231ps_fma(auVar33,_local_820,auVar210);
    auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),_local_7e0,auVar14);
    fVar131 = auVar216._0_4_;
    fVar258 = auVar197._0_4_;
    fVar164 = auVar216._4_4_;
    fVar273 = auVar197._4_4_;
    fVar166 = auVar216._8_4_;
    fVar274 = auVar197._8_4_;
    fVar184 = auVar216._12_4_;
    fVar275 = auVar197._12_4_;
    auVar34._28_4_ = local_7e0._28_4_;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(fVar275 * fVar184,
                            CONCAT48(fVar274 * fVar166,CONCAT44(fVar273 * fVar164,fVar258 * fVar131)
                                    )));
    auVar180 = vsubps_avx(ZEXT1632(auVar173),auVar34);
    auVar35._4_4_ = fVar225 * fVar225;
    auVar35._0_4_ = fVar302 * fVar302;
    auVar35._8_4_ = fVar226 * fVar226;
    auVar35._12_4_ = fVar227 * fVar227;
    auVar35._16_4_ = fVar228 * fVar228;
    auVar35._20_4_ = fVar229 * fVar229;
    auVar35._24_4_ = fVar230 * fVar230;
    auVar35._28_4_ = local_7e0._28_4_;
    auVar173 = vfmadd231ps_fma(auVar35,auVar210,auVar210);
    auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar14,auVar14);
    auVar12._28_4_ = uStack_824;
    auVar12._0_28_ =
         ZEXT1628(CONCAT412(fVar184 * fVar184,
                            CONCAT48(fVar166 * fVar166,CONCAT44(fVar164 * fVar164,fVar131 * fVar131)
                                    )));
    local_5c0 = vsubps_avx(ZEXT1632(auVar173),auVar12);
    auVar114 = vsqrtps_avx(auVar153);
    fVar131 = (auVar111._0_4_ + auVar114._0_4_) * 1.0000002;
    fVar164 = (auVar111._4_4_ + auVar114._4_4_) * 1.0000002;
    fVar166 = (auVar111._8_4_ + auVar114._8_4_) * 1.0000002;
    fVar184 = (auVar111._12_4_ + auVar114._12_4_) * 1.0000002;
    fVar185 = (auVar111._16_4_ + auVar114._16_4_) * 1.0000002;
    fVar186 = (auVar111._20_4_ + auVar114._20_4_) * 1.0000002;
    fVar187 = (auVar111._24_4_ + auVar114._24_4_) * 1.0000002;
    auVar36._4_4_ = fVar164 * fVar164;
    auVar36._0_4_ = fVar131 * fVar131;
    auVar36._8_4_ = fVar166 * fVar166;
    auVar36._12_4_ = fVar184 * fVar184;
    auVar36._16_4_ = fVar185 * fVar185;
    auVar36._20_4_ = fVar186 * fVar186;
    auVar36._24_4_ = fVar187 * fVar187;
    auVar36._28_4_ = auVar111._28_4_ + auVar114._28_4_;
    local_ae0._0_4_ = auVar180._0_4_ + auVar180._0_4_;
    local_ae0._4_4_ = auVar180._4_4_ + auVar180._4_4_;
    local_ae0._8_4_ = auVar180._8_4_ + auVar180._8_4_;
    local_ae0._12_4_ = auVar180._12_4_ + auVar180._12_4_;
    local_ae0._16_4_ = auVar180._16_4_ + auVar180._16_4_;
    local_ae0._20_4_ = auVar180._20_4_ + auVar180._20_4_;
    local_ae0._24_4_ = auVar180._24_4_ + auVar180._24_4_;
    fVar131 = auVar180._28_4_;
    local_ae0._28_4_ = fVar131 + fVar131;
    auVar180 = vsubps_avx(local_5c0,auVar36);
    auVar299 = ZEXT3264(auVar180);
    auVar251 = ZEXT1632(auVar197);
    local_560._28_4_ = (uint)auVar111._28_4_;
    local_560._0_28_ =
         ZEXT1628(CONCAT412(fVar275 * fVar275,
                            CONCAT48(fVar274 * fVar274,CONCAT44(fVar273 * fVar273,fVar258 * fVar258)
                                    )));
    local_620 = vsubps_avx(local_2e0,local_560);
    auVar37._4_4_ = local_ae0._4_4_ * local_ae0._4_4_;
    auVar37._0_4_ = local_ae0._0_4_ * local_ae0._0_4_;
    auVar37._8_4_ = local_ae0._8_4_ * local_ae0._8_4_;
    auVar37._12_4_ = local_ae0._12_4_ * local_ae0._12_4_;
    auVar37._16_4_ = local_ae0._16_4_ * local_ae0._16_4_;
    auVar37._20_4_ = local_ae0._20_4_ * local_ae0._20_4_;
    auVar37._24_4_ = local_ae0._24_4_ * local_ae0._24_4_;
    auVar37._28_4_ = fVar131;
    fVar164 = local_620._0_4_;
    local_5e0._0_4_ = fVar164 * 4.0;
    fVar166 = local_620._4_4_;
    local_5e0._4_4_ = fVar166 * 4.0;
    fVar184 = local_620._8_4_;
    fStack_5d8 = fVar184 * 4.0;
    fVar185 = local_620._12_4_;
    fStack_5d4 = fVar185 * 4.0;
    fVar186 = local_620._16_4_;
    fStack_5d0 = fVar186 * 4.0;
    fVar187 = local_620._20_4_;
    fStack_5cc = fVar187 * 4.0;
    fVar258 = local_620._24_4_;
    fStack_5c8 = fVar258 * 4.0;
    uStack_5c4 = 0x40800000;
    auVar38._4_4_ = auVar180._4_4_ * (float)local_5e0._4_4_;
    auVar38._0_4_ = auVar180._0_4_ * (float)local_5e0._0_4_;
    auVar38._8_4_ = auVar180._8_4_ * fStack_5d8;
    auVar38._12_4_ = auVar180._12_4_ * fStack_5d4;
    auVar38._16_4_ = auVar180._16_4_ * fStack_5d0;
    auVar38._20_4_ = auVar180._20_4_ * fStack_5cc;
    auVar38._24_4_ = auVar180._24_4_ * fStack_5c8;
    auVar38._28_4_ = 0x40800000;
    auVar111 = vsubps_avx(auVar37,auVar38);
    auVar153 = vcmpps_avx(auVar111,auVar115,5);
    auVar115 = ZEXT1632(auVar216);
    fVar131 = local_620._28_4_;
    if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar153 >> 0x7f,0) == '\0') &&
          (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar153 >> 0xbf,0) == '\0') &&
        (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar153[0x1f])
    {
      local_980._8_4_ = 0x7f800000;
      local_980._0_8_ = 0x7f8000007f800000;
      local_980._12_4_ = 0x7f800000;
      local_980._16_4_ = 0x7f800000;
      local_980._20_4_ = 0x7f800000;
      local_980._24_4_ = 0x7f800000;
      local_980._28_4_ = 0x7f800000;
      auVar238._8_4_ = 0xff800000;
      auVar238._0_8_ = 0xff800000ff800000;
      auVar238._12_4_ = 0xff800000;
      auVar238._16_4_ = 0xff800000;
      auVar238._20_4_ = 0xff800000;
      auVar238._24_4_ = 0xff800000;
      auVar238._28_4_ = 0xff800000;
      auVar254 = local_5c0;
    }
    else {
      auVar262 = vsqrtps_avx(auVar111);
      auVar253._0_4_ = fVar164 + fVar164;
      auVar253._4_4_ = fVar166 + fVar166;
      auVar253._8_4_ = fVar184 + fVar184;
      auVar253._12_4_ = fVar185 + fVar185;
      auVar253._16_4_ = fVar186 + fVar186;
      auVar253._20_4_ = fVar187 + fVar187;
      auVar253._24_4_ = fVar258 + fVar258;
      auVar253._28_4_ = fVar131 + fVar131;
      auVar261 = vrcpps_avx(auVar253);
      auVar12 = vcmpps_avx(auVar111,ZEXT432(0) << 0x20,5);
      auVar239._8_4_ = 0x3f800000;
      auVar239._0_8_ = &DAT_3f8000003f800000;
      auVar239._12_4_ = 0x3f800000;
      auVar239._16_4_ = 0x3f800000;
      auVar239._20_4_ = 0x3f800000;
      auVar239._24_4_ = 0x3f800000;
      auVar239._28_4_ = 0x3f800000;
      auVar197 = vfnmadd213ps_fma(auVar253,auVar261,auVar239);
      auVar197 = vfmadd132ps_fma(ZEXT1632(auVar197),auVar261,auVar261);
      uVar93 = CONCAT44(local_ae0._4_4_,local_ae0._0_4_);
      auVar116._0_8_ = uVar93 ^ 0x8000000080000000;
      auVar116._8_4_ = -local_ae0._8_4_;
      auVar116._12_4_ = -local_ae0._12_4_;
      auVar116._16_4_ = -local_ae0._16_4_;
      auVar116._20_4_ = -local_ae0._20_4_;
      auVar116._24_4_ = -local_ae0._24_4_;
      auVar116._28_4_ = -local_ae0._28_4_;
      auVar111 = vsubps_avx(auVar116,auVar262);
      auVar39._4_4_ = auVar111._4_4_ * auVar197._4_4_;
      auVar39._0_4_ = auVar111._0_4_ * auVar197._0_4_;
      auVar39._8_4_ = auVar111._8_4_ * auVar197._8_4_;
      auVar39._12_4_ = auVar111._12_4_ * auVar197._12_4_;
      auVar39._16_4_ = auVar111._16_4_ * 0.0;
      auVar39._20_4_ = auVar111._20_4_ * 0.0;
      auVar39._24_4_ = auVar111._24_4_ * 0.0;
      auVar39._28_4_ = auVar111._28_4_;
      auVar111 = vsubps_avx(auVar262,local_ae0);
      auVar40._4_4_ = auVar111._4_4_ * auVar197._4_4_;
      auVar40._0_4_ = auVar111._0_4_ * auVar197._0_4_;
      auVar40._8_4_ = auVar111._8_4_ * auVar197._8_4_;
      auVar40._12_4_ = auVar111._12_4_ * auVar197._12_4_;
      auVar40._16_4_ = auVar111._16_4_ * 0.0;
      auVar40._20_4_ = auVar111._20_4_ * 0.0;
      auVar40._24_4_ = auVar111._24_4_ * 0.0;
      auVar40._28_4_ = auVar111._28_4_;
      auVar197 = vfmadd213ps_fma(auVar251,auVar39,auVar115);
      local_4c0 = ZEXT1632(CONCAT412(fVar167 * auVar197._12_4_,
                                     CONCAT48(fVar165 * auVar197._8_4_,
                                              CONCAT44(fVar168 * auVar197._4_4_,
                                                       fVar163 * auVar197._0_4_))));
      auVar197 = vfmadd213ps_fma(auVar251,auVar40,auVar115);
      local_4e0 = ZEXT1632(CONCAT412(fVar167 * auVar197._12_4_,
                                     CONCAT48(fVar165 * auVar197._8_4_,
                                              CONCAT44(fVar168 * auVar197._4_4_,
                                                       fVar163 * auVar197._0_4_))));
      auVar247._8_4_ = 0x7f800000;
      auVar247._0_8_ = 0x7f8000007f800000;
      auVar247._12_4_ = 0x7f800000;
      auVar247._16_4_ = 0x7f800000;
      auVar247._20_4_ = 0x7f800000;
      auVar247._24_4_ = 0x7f800000;
      auVar247._28_4_ = 0x7f800000;
      local_980 = vblendvps_avx(auVar247,auVar39,auVar12);
      auVar111 = vandps_avx(local_560,local_920);
      auVar111 = vmaxps_avx(local_4a0,auVar111);
      auVar254._8_4_ = 0x36000000;
      auVar254._0_8_ = 0x3600000036000000;
      auVar254._12_4_ = 0x36000000;
      auVar254._16_4_ = 0x36000000;
      auVar254._20_4_ = 0x36000000;
      auVar254._24_4_ = 0x36000000;
      auVar254._28_4_ = 0x36000000;
      auVar41._4_4_ = auVar111._4_4_ * 1.9073486e-06;
      auVar41._0_4_ = auVar111._0_4_ * 1.9073486e-06;
      auVar41._8_4_ = auVar111._8_4_ * 1.9073486e-06;
      auVar41._12_4_ = auVar111._12_4_ * 1.9073486e-06;
      auVar41._16_4_ = auVar111._16_4_ * 1.9073486e-06;
      auVar41._20_4_ = auVar111._20_4_ * 1.9073486e-06;
      auVar41._24_4_ = auVar111._24_4_ * 1.9073486e-06;
      auVar41._28_4_ = auVar111._28_4_;
      auVar111 = vandps_avx(local_620,local_920);
      auVar111 = vcmpps_avx(auVar111,auVar41,1);
      auVar117._8_4_ = 0xff800000;
      auVar117._0_8_ = 0xff800000ff800000;
      auVar117._12_4_ = 0xff800000;
      auVar117._16_4_ = 0xff800000;
      auVar117._20_4_ = 0xff800000;
      auVar117._24_4_ = 0xff800000;
      auVar117._28_4_ = 0xff800000;
      auVar238 = vblendvps_avx(auVar117,auVar40,auVar12);
      auVar261 = auVar12 & auVar111;
      if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar261 >> 0x7f,0) != '\0') ||
            (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar261 >> 0xbf,0) != '\0') ||
          (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar261[0x1f] < '\0') {
        auVar153 = vandps_avx(auVar12,auVar111);
        auVar180 = vcmpps_avx(auVar180,ZEXT832(0) << 0x20,2);
        auVar280._8_4_ = 0xff800000;
        auVar280._0_8_ = 0xff800000ff800000;
        auVar280._12_4_ = 0xff800000;
        auVar280._16_4_ = 0xff800000;
        auVar280._20_4_ = 0xff800000;
        auVar280._24_4_ = 0xff800000;
        auVar280._28_4_ = 0xff800000;
        auVar298._8_4_ = 0x7f800000;
        auVar298._0_8_ = 0x7f8000007f800000;
        auVar298._12_4_ = 0x7f800000;
        auVar298._16_4_ = 0x7f800000;
        auVar298._20_4_ = 0x7f800000;
        auVar298._24_4_ = 0x7f800000;
        auVar298._28_4_ = 0x7f800000;
        auVar299 = ZEXT3264(auVar298);
        auVar111 = vblendvps_avx(auVar298,auVar280,auVar180);
        auVar197 = vpackssdw_avx(auVar153._0_16_,auVar153._16_16_);
        auVar261 = vpmovsxwd_avx2(auVar197);
        local_980 = vblendvps_avx(local_980,auVar111,auVar261);
        auVar254 = vblendvps_avx(auVar280,auVar298,auVar180);
        auVar238 = vblendvps_avx(auVar238,auVar254,auVar261);
        auVar124._0_8_ = auVar153._0_8_ ^ 0xffffffffffffffff;
        auVar124._8_4_ = auVar153._8_4_ ^ 0xffffffff;
        auVar124._12_4_ = auVar153._12_4_ ^ 0xffffffff;
        auVar124._16_4_ = auVar153._16_4_ ^ 0xffffffff;
        auVar124._20_4_ = auVar153._20_4_ ^ 0xffffffff;
        auVar124._24_4_ = auVar153._24_4_ ^ 0xffffffff;
        auVar124._28_4_ = auVar153._28_4_ ^ 0xffffffff;
        auVar153 = vorps_avx(auVar180,auVar124);
        auVar153 = vandps_avx(auVar12,auVar153);
      }
    }
    auVar257 = ZEXT3264(auVar254);
    auVar243 = ZEXT3264(auVar238);
    auVar276 = ZEXT3264(auVar12);
    auVar266 = ZEXT3264(local_ae0);
    auVar111 = local_380 & auVar153;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0x7f,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar111 >> 0xbf,0) == '\0') &&
        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar111[0x1f])
    {
LAB_0198139f:
      auVar221._8_4_ = 0x3f800000;
      auVar221._0_8_ = &DAT_3f8000003f800000;
      auVar221._12_4_ = 0x3f800000;
      auVar221._16_4_ = 0x3f800000;
      auVar221._20_4_ = 0x3f800000;
      auVar221._24_4_ = 0x3f800000;
      auVar221._28_4_ = 0x3f800000;
    }
    else {
      fVar273 = *(float *)(ray + k * 4 + 0x80) - (float)local_880._0_4_;
      auVar118._4_4_ = fVar273;
      auVar118._0_4_ = fVar273;
      auVar118._8_4_ = fVar273;
      auVar118._12_4_ = fVar273;
      auVar118._16_4_ = fVar273;
      auVar118._20_4_ = fVar273;
      auVar118._24_4_ = fVar273;
      auVar118._28_4_ = fVar273;
      auVar261 = vminps_avx(auVar118,auVar238);
      auVar42._4_4_ = fVar225 * local_a00._4_4_;
      auVar42._0_4_ = fVar302 * (float)local_a00._0_4_;
      auVar42._8_4_ = fVar226 * local_a00._8_4_;
      auVar42._12_4_ = fVar227 * local_a00._12_4_;
      auVar42._16_4_ = fVar228 * local_a00._16_4_;
      auVar42._20_4_ = fVar229 * local_a00._20_4_;
      auVar42._24_4_ = fVar230 * local_a00._24_4_;
      auVar42._28_4_ = auVar13._28_4_;
      auVar197 = vfmadd213ps_fma(auVar210,local_700,auVar42);
      auVar216 = vfmadd213ps_fma(auVar14,local_9e0,ZEXT1632(auVar197));
      auVar43._4_4_ = local_a00._4_4_ * (float)local_840._4_4_;
      auVar43._0_4_ = (float)local_a00._0_4_ * (float)local_840._0_4_;
      auVar43._8_4_ = local_a00._8_4_ * fStack_838;
      auVar43._12_4_ = local_a00._12_4_ * fStack_834;
      auVar43._16_4_ = local_a00._16_4_ * fStack_830;
      auVar43._20_4_ = local_a00._20_4_ * fStack_82c;
      auVar43._24_4_ = local_a00._24_4_ * fStack_828;
      auVar43._28_4_ = 0;
      auVar197 = vfmadd231ps_fma(auVar43,local_700,_local_820);
      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar197),_local_7e0,local_9e0);
      auVar111 = vandps_avx(ZEXT1632(auVar173),local_920);
      auVar286._8_4_ = 0x219392ef;
      auVar286._0_8_ = 0x219392ef219392ef;
      auVar286._12_4_ = 0x219392ef;
      auVar286._16_4_ = 0x219392ef;
      auVar286._20_4_ = 0x219392ef;
      auVar286._24_4_ = 0x219392ef;
      auVar286._28_4_ = 0x219392ef;
      auVar180 = vcmpps_avx(auVar111,auVar286,1);
      auVar111 = vrcpps_avx(ZEXT1632(auVar173));
      auVar221._8_4_ = 0x3f800000;
      auVar221._0_8_ = &DAT_3f8000003f800000;
      auVar221._12_4_ = 0x3f800000;
      auVar221._16_4_ = 0x3f800000;
      auVar221._20_4_ = 0x3f800000;
      auVar221._24_4_ = 0x3f800000;
      auVar221._28_4_ = 0x3f800000;
      auVar299 = ZEXT3264(auVar221);
      auVar210 = ZEXT1632(auVar173);
      auVar197 = vfnmadd213ps_fma(auVar111,auVar210,auVar221);
      auVar197 = vfmadd132ps_fma(ZEXT1632(auVar197),auVar111,auVar111);
      auVar206._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
      auVar206._8_4_ = auVar173._8_4_ ^ 0x80000000;
      auVar206._12_4_ = auVar173._12_4_ ^ 0x80000000;
      auVar206._16_4_ = 0x80000000;
      auVar206._20_4_ = 0x80000000;
      auVar206._24_4_ = 0x80000000;
      auVar206._28_4_ = 0x80000000;
      auVar255._0_4_ = auVar197._0_4_ * -auVar216._0_4_;
      auVar255._4_4_ = auVar197._4_4_ * -auVar216._4_4_;
      auVar255._8_4_ = auVar197._8_4_ * -auVar216._8_4_;
      auVar255._12_4_ = auVar197._12_4_ * -auVar216._12_4_;
      auVar255._16_4_ = 0x80000000;
      auVar255._20_4_ = 0x80000000;
      auVar255._24_4_ = 0x80000000;
      auVar255._28_4_ = 0;
      auVar111 = vcmpps_avx(auVar210,auVar206,1);
      auVar111 = vorps_avx(auVar180,auVar111);
      auVar287._8_4_ = 0xff800000;
      auVar287._0_8_ = 0xff800000ff800000;
      auVar287._12_4_ = 0xff800000;
      auVar287._16_4_ = 0xff800000;
      auVar287._20_4_ = 0xff800000;
      auVar287._24_4_ = 0xff800000;
      auVar287._28_4_ = 0xff800000;
      auVar111 = vblendvps_avx(auVar255,auVar287,auVar111);
      auVar78._4_4_ = fStack_39c;
      auVar78._0_4_ = local_3a0;
      auVar78._8_4_ = fStack_398;
      auVar78._12_4_ = fStack_394;
      auVar78._16_4_ = fStack_390;
      auVar78._20_4_ = fStack_38c;
      auVar78._24_4_ = fStack_388;
      auVar78._28_4_ = fStack_384;
      auVar13 = vmaxps_avx(auVar78,local_980);
      auVar13 = vmaxps_avx(auVar13,auVar111);
      auVar111 = vcmpps_avx(auVar210,auVar206,6);
      auVar111 = vorps_avx(auVar180,auVar111);
      auVar288._8_4_ = 0x7f800000;
      auVar288._0_8_ = 0x7f8000007f800000;
      auVar288._12_4_ = 0x7f800000;
      auVar288._16_4_ = 0x7f800000;
      auVar288._20_4_ = 0x7f800000;
      auVar288._24_4_ = 0x7f800000;
      auVar288._28_4_ = 0x7f800000;
      auVar111 = vblendvps_avx(auVar255,auVar288,auVar111);
      auVar210 = vminps_avx(auVar261,auVar111);
      auVar111 = vsubps_avx(ZEXT832(0) << 0x20,auVar15);
      auVar180 = vsubps_avx(ZEXT832(0) << 0x20,local_8c0._0_32_);
      auVar44._4_4_ = auVar180._4_4_ * fVar128;
      auVar44._0_4_ = auVar180._0_4_ * fVar101;
      auVar44._8_4_ = auVar180._8_4_ * fVar129;
      auVar44._12_4_ = auVar180._12_4_ * fVar130;
      auVar44._16_4_ = auVar180._16_4_ * fVar295;
      auVar44._20_4_ = auVar180._20_4_ * fVar300;
      auVar44._24_4_ = auVar180._24_4_ * fVar301;
      auVar44._28_4_ = auVar180._28_4_;
      auVar197 = vfnmsub231ps_fma(auVar44,local_a20,auVar111);
      auVar111 = vsubps_avx(ZEXT832(0) << 0x20,auVar207);
      auVar216 = vfnmadd231ps_fma(ZEXT1632(auVar197),local_960,auVar111);
      auVar45._4_4_ = fVar128 * (float)local_840._4_4_;
      auVar45._0_4_ = fVar101 * (float)local_840._0_4_;
      auVar45._8_4_ = fVar129 * fStack_838;
      auVar45._12_4_ = fVar130 * fStack_834;
      auVar45._16_4_ = fVar295 * fStack_830;
      auVar45._20_4_ = fVar300 * fStack_82c;
      auVar45._24_4_ = fVar301 * fStack_828;
      auVar45._28_4_ = auVar111._28_4_;
      auVar197 = vfnmsub231ps_fma(auVar45,local_a20,_local_820);
      auVar266 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar173 = vfnmadd231ps_fma(ZEXT1632(auVar197),_local_7e0,local_960);
      auVar111 = vandps_avx(ZEXT1632(auVar173),local_920);
      auVar14 = vrcpps_avx(ZEXT1632(auVar173));
      auVar119._8_4_ = 0x219392ef;
      auVar119._0_8_ = 0x219392ef219392ef;
      auVar119._12_4_ = 0x219392ef;
      auVar119._16_4_ = 0x219392ef;
      auVar119._20_4_ = 0x219392ef;
      auVar119._24_4_ = 0x219392ef;
      auVar119._28_4_ = 0x219392ef;
      auVar180 = vcmpps_avx(auVar111,auVar119,1);
      auVar207 = ZEXT1632(auVar173);
      auVar197 = vfnmadd213ps_fma(auVar14,auVar207,auVar221);
      auVar197 = vfmadd132ps_fma(ZEXT1632(auVar197),auVar14,auVar14);
      auVar256._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
      auVar256._8_4_ = auVar173._8_4_ ^ 0x80000000;
      auVar256._12_4_ = auVar173._12_4_ ^ 0x80000000;
      auVar256._16_4_ = 0x80000000;
      auVar256._20_4_ = 0x80000000;
      auVar256._24_4_ = 0x80000000;
      auVar256._28_4_ = 0x80000000;
      auVar257 = ZEXT3264(auVar256);
      auVar46._4_4_ = auVar197._4_4_ * -auVar216._4_4_;
      auVar46._0_4_ = auVar197._0_4_ * -auVar216._0_4_;
      auVar46._8_4_ = auVar197._8_4_ * -auVar216._8_4_;
      auVar46._12_4_ = auVar197._12_4_ * -auVar216._12_4_;
      auVar46._16_4_ = 0x80000000;
      auVar46._20_4_ = 0x80000000;
      auVar46._24_4_ = 0x80000000;
      auVar46._28_4_ = 0x80000000;
      auVar243 = ZEXT3264(auVar46);
      auVar111 = vcmpps_avx(auVar207,auVar256,1);
      auVar111 = vorps_avx(auVar111,auVar180);
      auVar222._8_4_ = 0xff800000;
      auVar222._0_8_ = 0xff800000ff800000;
      auVar222._12_4_ = 0xff800000;
      auVar222._16_4_ = 0xff800000;
      auVar222._20_4_ = 0xff800000;
      auVar222._24_4_ = 0xff800000;
      auVar222._28_4_ = 0xff800000;
      auVar111 = vblendvps_avx(auVar46,auVar222,auVar111);
      auVar276 = ZEXT3264(auVar111);
      local_9a0 = vmaxps_avx(auVar13,auVar111);
      auVar111 = vcmpps_avx(auVar207,auVar256,6);
      auVar111 = vorps_avx(auVar180,auVar111);
      auVar208._8_4_ = 0x7f800000;
      auVar208._0_8_ = 0x7f8000007f800000;
      auVar208._12_4_ = 0x7f800000;
      auVar208._16_4_ = 0x7f800000;
      auVar208._20_4_ = 0x7f800000;
      auVar208._24_4_ = 0x7f800000;
      auVar208._28_4_ = 0x7f800000;
      auVar111 = vblendvps_avx(auVar46,auVar208,auVar111);
      auVar153 = vandps_avx(local_380,auVar153);
      local_3e0 = vminps_avx(auVar210,auVar111);
      auVar111 = vcmpps_avx(local_9a0,local_3e0,2);
      auVar180 = auVar153 & auVar111;
      if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar180 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar180 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar180 >> 0x7f,0) != '\0') ||
            (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar180 >> 0xbf,0) != '\0') ||
          (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar180[0x1f] < '\0') {
        auVar180 = vminps_avx(local_4c0,auVar221);
        auVar220 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar180 = vmaxps_avx(auVar180,ZEXT832(0) << 0x20);
        auVar13 = vminps_avx(local_4e0,auVar221);
        auVar13 = vmaxps_avx(auVar13,ZEXT832(0) << 0x20);
        auVar48._4_4_ = (auVar180._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar180._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar180._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar180._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar180._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar180._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar180._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar180._28_4_ + 7.0;
        auVar197 = vfmadd213ps_fma(auVar48,local_900,local_720);
        auVar49._4_4_ = (auVar13._4_4_ + 1.0) * 0.125;
        auVar49._0_4_ = (auVar13._0_4_ + 0.0) * 0.125;
        auVar49._8_4_ = (auVar13._8_4_ + 2.0) * 0.125;
        auVar49._12_4_ = (auVar13._12_4_ + 3.0) * 0.125;
        auVar49._16_4_ = (auVar13._16_4_ + 4.0) * 0.125;
        auVar49._20_4_ = (auVar13._20_4_ + 5.0) * 0.125;
        auVar49._24_4_ = (auVar13._24_4_ + 6.0) * 0.125;
        auVar49._28_4_ = auVar13._28_4_ + 7.0;
        auVar216 = vfmadd213ps_fma(auVar49,local_900,local_720);
        auVar180 = vminps_avx(local_740,local_760);
        auVar13 = vminps_avx(local_780,auVar16);
        auVar180 = vminps_avx(auVar180,auVar13);
        auVar114 = vsubps_avx(auVar180,auVar114);
        auVar153 = vandps_avx(auVar111,auVar153);
        local_4c0 = ZEXT1632(auVar197);
        local_4e0 = ZEXT1632(auVar216);
        auVar50._4_4_ = auVar114._4_4_ * 0.99999976;
        auVar50._0_4_ = auVar114._0_4_ * 0.99999976;
        auVar50._8_4_ = auVar114._8_4_ * 0.99999976;
        auVar50._12_4_ = auVar114._12_4_ * 0.99999976;
        auVar50._16_4_ = auVar114._16_4_ * 0.99999976;
        auVar50._20_4_ = auVar114._20_4_ * 0.99999976;
        auVar50._24_4_ = auVar114._24_4_ * 0.99999976;
        auVar50._28_4_ = 0x3f7ffffc;
        auVar111 = vmaxps_avx(ZEXT832(0) << 0x20,auVar50);
        auVar51._4_4_ = auVar111._4_4_ * auVar111._4_4_;
        auVar51._0_4_ = auVar111._0_4_ * auVar111._0_4_;
        auVar51._8_4_ = auVar111._8_4_ * auVar111._8_4_;
        auVar51._12_4_ = auVar111._12_4_ * auVar111._12_4_;
        auVar51._16_4_ = auVar111._16_4_ * auVar111._16_4_;
        auVar51._20_4_ = auVar111._20_4_ * auVar111._20_4_;
        auVar51._24_4_ = auVar111._24_4_ * auVar111._24_4_;
        auVar51._28_4_ = auVar111._28_4_;
        auVar114 = vsubps_avx(local_5c0,auVar51);
        auVar276 = ZEXT3264(auVar114);
        auVar52._4_4_ = auVar114._4_4_ * (float)local_5e0._4_4_;
        auVar52._0_4_ = auVar114._0_4_ * (float)local_5e0._0_4_;
        auVar52._8_4_ = auVar114._8_4_ * fStack_5d8;
        auVar52._12_4_ = auVar114._12_4_ * fStack_5d4;
        auVar52._16_4_ = auVar114._16_4_ * fStack_5d0;
        auVar52._20_4_ = auVar114._20_4_ * fStack_5cc;
        auVar52._24_4_ = auVar114._24_4_ * fStack_5c8;
        auVar52._28_4_ = auVar111._28_4_;
        auVar111 = vsubps_avx(auVar37,auVar52);
        auVar63 = ZEXT412(0);
        auVar180 = ZEXT1232(auVar63) << 0x20;
        local_860 = ZEXT1232(auVar63) << 0x20;
        _local_ac0 = vcmpps_avx(auVar111,ZEXT832(0) << 0x20,5);
        auVar266 = ZEXT3264(_local_ac0);
        if ((((((((_local_ac0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_ac0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_ac0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_ac0 >> 0x7f,0) == '\0') &&
              (_local_ac0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_ac0 >> 0xbf,0) == '\0') &&
            (_local_ac0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_ac0[0x1f]) {
          _local_5e0 = local_860;
          _local_600 = ZEXT1232(auVar63) << 0x20;
          auVar210 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar240._8_4_ = 0x7f800000;
          auVar240._0_8_ = 0x7f8000007f800000;
          auVar240._12_4_ = 0x7f800000;
          auVar240._16_4_ = 0x7f800000;
          auVar240._20_4_ = 0x7f800000;
          auVar240._24_4_ = 0x7f800000;
          auVar240._28_4_ = 0x7f800000;
          auVar248._8_4_ = 0xff800000;
          auVar248._0_8_ = 0xff800000ff800000;
          auVar248._12_4_ = 0xff800000;
          auVar248._16_4_ = 0xff800000;
          auVar248._20_4_ = 0xff800000;
          auVar248._24_4_ = 0xff800000;
          auVar248._28_4_ = 0xff800000;
          _local_ac0 = auVar15;
        }
        else {
          auVar179._0_4_ = fVar164 + fVar164;
          auVar179._4_4_ = fVar166 + fVar166;
          auVar179._8_4_ = fVar184 + fVar184;
          auVar179._12_4_ = fVar185 + fVar185;
          auVar179._16_4_ = fVar186 + fVar186;
          auVar179._20_4_ = fVar187 + fVar187;
          auVar179._24_4_ = fVar258 + fVar258;
          auVar179._28_4_ = fVar131 + fVar131;
          auVar180 = vrcpps_avx(auVar179);
          auVar197 = vfnmadd213ps_fma(auVar179,auVar180,auVar221);
          auVar197 = vfmadd132ps_fma(ZEXT1632(auVar197),auVar180,auVar180);
          auVar180 = vsqrtps_avx(auVar111);
          uVar93 = CONCAT44(local_ae0._4_4_,local_ae0._0_4_);
          auVar223._0_8_ = uVar93 ^ 0x8000000080000000;
          auVar223._8_4_ = -local_ae0._8_4_;
          auVar223._12_4_ = -local_ae0._12_4_;
          auVar223._16_4_ = -local_ae0._16_4_;
          auVar223._20_4_ = -local_ae0._20_4_;
          auVar223._24_4_ = -local_ae0._24_4_;
          auVar223._28_4_ = -local_ae0._28_4_;
          auVar13 = vsubps_avx(auVar223,auVar180);
          auVar180 = vsubps_avx(auVar180,local_ae0);
          fVar295 = auVar13._0_4_ * auVar197._0_4_;
          fVar300 = auVar13._4_4_ * auVar197._4_4_;
          auVar53._4_4_ = fVar300;
          auVar53._0_4_ = fVar295;
          fVar301 = auVar13._8_4_ * auVar197._8_4_;
          auVar53._8_4_ = fVar301;
          fVar185 = auVar13._12_4_ * auVar197._12_4_;
          auVar53._12_4_ = fVar185;
          fVar186 = auVar13._16_4_ * 0.0;
          auVar53._16_4_ = fVar186;
          fVar187 = auVar13._20_4_ * 0.0;
          auVar53._20_4_ = fVar187;
          fVar302 = auVar13._24_4_ * 0.0;
          auVar53._24_4_ = fVar302;
          auVar53._28_4_ = 0x3f800000;
          auVar299 = ZEXT3264(auVar53);
          fVar101 = auVar180._0_4_ * auVar197._0_4_;
          fVar128 = auVar180._4_4_ * auVar197._4_4_;
          auVar54._4_4_ = fVar128;
          auVar54._0_4_ = fVar101;
          fVar164 = auVar180._8_4_ * auVar197._8_4_;
          auVar54._8_4_ = fVar164;
          fVar129 = auVar180._12_4_ * auVar197._12_4_;
          auVar54._12_4_ = fVar129;
          fVar166 = auVar180._16_4_ * 0.0;
          auVar54._16_4_ = fVar166;
          fVar130 = auVar180._20_4_ * 0.0;
          auVar54._20_4_ = fVar130;
          fVar184 = auVar180._24_4_ * 0.0;
          auVar54._24_4_ = fVar184;
          auVar54._28_4_ = fVar131;
          auVar197 = vfmadd213ps_fma(auVar251,auVar53,auVar115);
          auVar216 = vfmadd213ps_fma(auVar251,auVar54,auVar115);
          auVar55._28_4_ = auVar13._28_4_;
          auVar55._0_28_ =
               ZEXT1628(CONCAT412(fVar167 * auVar197._12_4_,
                                  CONCAT48(fVar165 * auVar197._8_4_,
                                           CONCAT44(fVar168 * auVar197._4_4_,
                                                    fVar163 * auVar197._0_4_))));
          auVar180 = ZEXT1632(CONCAT412(fVar167 * auVar216._12_4_,
                                        CONCAT48(fVar165 * auVar216._8_4_,
                                                 CONCAT44(fVar168 * auVar216._4_4_,
                                                          fVar163 * auVar216._0_4_))));
          auVar197 = vfmadd213ps_fma(local_520,auVar55,auVar177);
          auVar216 = vfmadd213ps_fma(local_520,auVar180,auVar177);
          auVar173 = vfmadd213ps_fma(local_540,auVar55,auVar112);
          auVar108 = vfmadd213ps_fma(local_540,auVar180,auVar112);
          auVar282 = vfmadd213ps_fma(auVar55,local_500,_local_600);
          auVar2 = vfmadd213ps_fma(local_500,auVar180,_local_600);
          auVar56._4_4_ = fVar300 * (float)local_7e0._4_4_;
          auVar56._0_4_ = fVar295 * (float)local_7e0._0_4_;
          auVar56._8_4_ = fVar301 * fStack_7d8;
          auVar56._12_4_ = fVar185 * fStack_7d4;
          auVar56._16_4_ = fVar186 * fStack_7d0;
          auVar56._20_4_ = fVar187 * fStack_7cc;
          auVar56._24_4_ = fVar302 * fStack_7c8;
          auVar56._28_4_ = 0;
          auVar180 = vsubps_avx(auVar56,ZEXT1632(auVar197));
          auVar211._0_4_ = fVar295 * (float)local_820._0_4_;
          auVar211._4_4_ = fVar300 * (float)local_820._4_4_;
          auVar211._8_4_ = fVar301 * fStack_818;
          auVar211._12_4_ = fVar185 * fStack_814;
          auVar211._16_4_ = fVar186 * fStack_810;
          auVar211._20_4_ = fVar187 * fStack_80c;
          auVar211._24_4_ = fVar302 * fStack_808;
          auVar211._28_4_ = 0;
          auVar210 = vsubps_avx(auVar211,ZEXT1632(auVar173));
          auVar241._0_4_ = (float)local_840._0_4_ * fVar295;
          auVar241._4_4_ = (float)local_840._4_4_ * fVar300;
          auVar241._8_4_ = fStack_838 * fVar301;
          auVar241._12_4_ = fStack_834 * fVar185;
          auVar241._16_4_ = fStack_830 * fVar186;
          auVar241._20_4_ = fStack_82c * fVar187;
          auVar241._24_4_ = fStack_828 * fVar302;
          auVar241._28_4_ = 0;
          auVar13 = vsubps_avx(auVar241,ZEXT1632(auVar282));
          auVar220 = auVar13._0_28_;
          auVar57._4_4_ = (float)local_7e0._4_4_ * fVar128;
          auVar57._0_4_ = (float)local_7e0._0_4_ * fVar101;
          auVar57._8_4_ = fStack_7d8 * fVar164;
          auVar57._12_4_ = fStack_7d4 * fVar129;
          auVar57._16_4_ = fStack_7d0 * fVar166;
          auVar57._20_4_ = fStack_7cc * fVar130;
          auVar57._24_4_ = fStack_7c8 * fVar184;
          auVar57._28_4_ = 0;
          local_860 = vsubps_avx(auVar57,ZEXT1632(auVar216));
          auVar58._4_4_ = (float)local_820._4_4_ * fVar128;
          auVar58._0_4_ = (float)local_820._0_4_ * fVar101;
          auVar58._8_4_ = fStack_818 * fVar164;
          auVar58._12_4_ = fStack_814 * fVar129;
          auVar58._16_4_ = fStack_810 * fVar166;
          auVar58._20_4_ = fStack_80c * fVar130;
          auVar58._24_4_ = fStack_808 * fVar184;
          auVar58._28_4_ = local_860._28_4_;
          _local_5e0 = vsubps_avx(auVar58,ZEXT1632(auVar108));
          auVar59._4_4_ = (float)local_840._4_4_ * fVar128;
          auVar59._0_4_ = (float)local_840._0_4_ * fVar101;
          auVar59._8_4_ = fStack_838 * fVar164;
          auVar59._12_4_ = fStack_834 * fVar129;
          auVar59._16_4_ = fStack_830 * fVar166;
          auVar59._20_4_ = fStack_82c * fVar130;
          auVar59._24_4_ = fStack_828 * fVar184;
          auVar59._28_4_ = local_5e0._28_4_;
          _local_600 = vsubps_avx(auVar59,ZEXT1632(auVar2));
          auVar13 = vcmpps_avx(auVar111,_DAT_02020f00,5);
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar240 = vblendvps_avx(auVar242,auVar53,auVar13);
          auVar111 = vandps_avx(local_920,local_560);
          auVar111 = vmaxps_avx(local_4a0,auVar111);
          auVar60._4_4_ = auVar111._4_4_ * 1.9073486e-06;
          auVar60._0_4_ = auVar111._0_4_ * 1.9073486e-06;
          auVar60._8_4_ = auVar111._8_4_ * 1.9073486e-06;
          auVar60._12_4_ = auVar111._12_4_ * 1.9073486e-06;
          auVar60._16_4_ = auVar111._16_4_ * 1.9073486e-06;
          auVar60._20_4_ = auVar111._20_4_ * 1.9073486e-06;
          auVar60._24_4_ = auVar111._24_4_ * 1.9073486e-06;
          auVar60._28_4_ = auVar111._28_4_;
          auVar111 = vandps_avx(local_920,local_620);
          auVar111 = vcmpps_avx(auVar111,auVar60,1);
          auVar249._8_4_ = 0xff800000;
          auVar249._0_8_ = 0xff800000ff800000;
          auVar249._12_4_ = 0xff800000;
          auVar249._16_4_ = 0xff800000;
          auVar249._20_4_ = 0xff800000;
          auVar249._24_4_ = 0xff800000;
          auVar249._28_4_ = 0xff800000;
          auVar248 = vblendvps_avx(auVar249,auVar54,auVar13);
          auVar14 = auVar13 & auVar111;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar14 >> 0x7f,0) == '\0') &&
                (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar14 >> 0xbf,0) == '\0') &&
              (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar14[0x1f]) {
            auVar266 = ZEXT3264(_local_ac0);
          }
          else {
            auVar111 = vandps_avx(auVar111,auVar13);
            auVar14 = vcmpps_avx(auVar114,ZEXT832(0) << 0x20,2);
            auVar281._8_4_ = 0xff800000;
            auVar281._0_8_ = 0xff800000ff800000;
            auVar281._12_4_ = 0xff800000;
            auVar281._16_4_ = 0xff800000;
            auVar281._20_4_ = 0xff800000;
            auVar281._24_4_ = 0xff800000;
            auVar281._28_4_ = 0xff800000;
            auVar285._8_4_ = 0x7f800000;
            auVar285._0_8_ = 0x7f8000007f800000;
            auVar285._12_4_ = 0x7f800000;
            auVar285._16_4_ = 0x7f800000;
            auVar285._20_4_ = 0x7f800000;
            auVar285._24_4_ = 0x7f800000;
            auVar285._28_4_ = 0x7f800000;
            auVar114 = vblendvps_avx(auVar285,auVar281,auVar14);
            auVar197 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
            auVar207 = vpmovsxwd_avx2(auVar197);
            auVar240 = vblendvps_avx(auVar240,auVar114,auVar207);
            auVar114 = vblendvps_avx(auVar281,auVar285,auVar14);
            auVar276 = ZEXT3264(auVar114);
            auVar248 = vblendvps_avx(auVar248,auVar114,auVar207);
            auVar265._0_8_ = auVar111._0_8_ ^ 0xffffffffffffffff;
            auVar265._8_4_ = auVar111._8_4_ ^ 0xffffffff;
            auVar265._12_4_ = auVar111._12_4_ ^ 0xffffffff;
            auVar265._16_4_ = auVar111._16_4_ ^ 0xffffffff;
            auVar265._20_4_ = auVar111._20_4_ ^ 0xffffffff;
            auVar265._24_4_ = auVar111._24_4_ ^ 0xffffffff;
            auVar265._28_4_ = auVar111._28_4_ ^ 0xffffffff;
            auVar111 = vorps_avx(auVar14,auVar265);
            auVar111 = vandps_avx(auVar111,auVar13);
            auVar266 = ZEXT3264(auVar111);
          }
        }
        auVar271 = ZEXT3264(local_9a0);
        local_440 = local_9a0;
        local_420 = vminps_avx(local_3e0,auVar240);
        _local_400 = vmaxps_avx(local_9a0,auVar248);
        auVar269 = ZEXT3264(_local_400);
        auVar111 = vcmpps_avx(local_9a0,local_420,2);
        local_500 = vandps_avx(auVar111,auVar153);
        auVar243 = ZEXT3264(local_500);
        local_580 = local_500;
        auVar111 = vcmpps_avx(_local_400,local_3e0,2);
        local_5a0 = vandps_avx(auVar111,auVar153);
        auVar257 = ZEXT3264(local_5a0);
        auVar153 = vorps_avx(local_5a0,local_500);
        if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar153 >> 0x7f,0) != '\0') ||
              (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar153 >> 0xbf,0) != '\0') ||
            (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar153[0x1f] < '\0') {
          local_540 = local_5a0;
          local_560._0_8_ = auVar266._0_8_ ^ 0xffffffffffffffff;
          local_560._8_4_ = auVar266._8_4_ ^ 0xffffffff;
          local_560._12_4_ = auVar266._12_4_ ^ 0xffffffff;
          local_560._16_4_ = auVar266._16_4_ ^ 0xffffffff;
          local_560._20_4_ = auVar266._20_4_ ^ 0xffffffff;
          local_560._24_4_ = auVar266._24_4_ ^ 0xffffffff;
          local_560._28_4_ = auVar266._28_4_ ^ 0xffffffff;
          auVar243 = ZEXT3264(local_560);
          auVar61._4_4_ = auVar220._4_4_ * (float)local_840._4_4_;
          auVar61._0_4_ = auVar220._0_4_ * (float)local_840._0_4_;
          auVar61._8_4_ = auVar220._8_4_ * fStack_838;
          auVar61._12_4_ = auVar220._12_4_ * fStack_834;
          auVar61._16_4_ = auVar220._16_4_ * fStack_830;
          auVar61._20_4_ = auVar220._20_4_ * fStack_82c;
          auVar61._24_4_ = auVar220._24_4_ * fStack_828;
          auVar61._28_4_ = auVar153._28_4_;
          auVar197 = vfmadd132ps_fma(auVar210,auVar61,_local_820);
          auVar197 = vfmadd132ps_fma(auVar180,ZEXT1632(auVar197),_local_7e0);
          auVar153 = vandps_avx(ZEXT1632(auVar197),local_920);
          auVar155._8_4_ = 0x3e99999a;
          auVar155._0_8_ = 0x3e99999a3e99999a;
          auVar155._12_4_ = 0x3e99999a;
          auVar155._16_4_ = 0x3e99999a;
          auVar155._20_4_ = 0x3e99999a;
          auVar155._24_4_ = 0x3e99999a;
          auVar155._28_4_ = 0x3e99999a;
          auVar153 = vcmpps_avx(auVar153,auVar155,1);
          auVar153 = vorps_avx(auVar153,local_560);
          auVar156._8_4_ = 3;
          auVar156._0_8_ = 0x300000003;
          auVar156._12_4_ = 3;
          auVar156._16_4_ = 3;
          auVar156._20_4_ = 3;
          auVar156._24_4_ = 3;
          auVar156._28_4_ = 3;
          auVar181._8_4_ = 2;
          auVar181._0_8_ = 0x200000002;
          auVar181._12_4_ = 2;
          auVar181._16_4_ = 2;
          auVar181._20_4_ = 2;
          auVar181._24_4_ = 2;
          auVar181._28_4_ = 2;
          auVar153 = vblendvps_avx(auVar181,auVar156,auVar153);
          uVar97 = (undefined4)uVar98;
          local_620._4_4_ = uVar97;
          local_620._0_4_ = uVar97;
          local_620._8_4_ = uVar97;
          local_620._12_4_ = uVar97;
          local_620._16_4_ = uVar97;
          local_620._20_4_ = uVar97;
          local_620._24_4_ = uVar97;
          local_620._28_4_ = uVar97;
          local_520 = vpcmpgtd_avx2(auVar153,local_620);
          local_580 = vpandn_avx2(local_520,local_500);
          auVar153 = local_500 & ~local_520;
          local_5c0._0_8_ = uVar98;
          if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar153 >> 0x7f,0) != '\0') ||
                (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar153 >> 0xbf,0) != '\0') ||
              (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar153[0x1f] < '\0') {
            auVar216 = vminps_avx(local_a60,local_a80);
            auVar197 = vmaxps_avx(local_a60,local_a80);
            auVar173 = vminps_avx(local_a70,_local_a90);
            auVar108 = vminps_avx(auVar216,auVar173);
            auVar216 = vmaxps_avx(local_a70,_local_a90);
            auVar173 = vmaxps_avx(auVar197,auVar216);
            auVar189._8_4_ = 0x7fffffff;
            auVar189._0_8_ = 0x7fffffff7fffffff;
            auVar189._12_4_ = 0x7fffffff;
            local_720._0_16_ = auVar189;
            auVar197 = vandps_avx(auVar108,auVar189);
            auVar216 = vandps_avx(auVar173,auVar189);
            auVar197 = vmaxps_avx(auVar197,auVar216);
            auVar216 = vmovshdup_avx(auVar197);
            auVar216 = vmaxss_avx(auVar216,auVar197);
            auVar197 = vshufpd_avx(auVar197,auVar197,1);
            auVar197 = vmaxss_avx(auVar197,auVar216);
            local_8c0._0_4_ = auVar197._0_4_ * 1.9073486e-06;
            _local_7c0 = vshufps_avx(auVar173,auVar173,0xff);
            _auStack_7b0 = auVar16._16_16_;
            local_800._4_4_ = local_9a0._4_4_ + (float)local_7a0._4_4_;
            local_800._0_4_ = local_9a0._0_4_ + (float)local_7a0._0_4_;
            fStack_7f8 = local_9a0._8_4_ + fStack_798;
            fStack_7f4 = local_9a0._12_4_ + fStack_794;
            fStack_7f0 = local_9a0._16_4_ + fStack_790;
            fStack_7ec = local_9a0._20_4_ + fStack_78c;
            fStack_7e8 = local_9a0._24_4_ + fStack_788;
            fStack_7e4 = local_9a0._28_4_ + fStack_784;
            local_ae0 = _local_400;
            do {
              auVar157._8_4_ = 0x7f800000;
              auVar157._0_8_ = 0x7f8000007f800000;
              auVar157._12_4_ = 0x7f800000;
              auVar157._16_4_ = 0x7f800000;
              auVar157._20_4_ = 0x7f800000;
              auVar157._24_4_ = 0x7f800000;
              auVar157._28_4_ = 0x7f800000;
              auVar153 = vblendvps_avx(auVar157,auVar271._0_32_,local_580);
              auVar111 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar111 = vminps_avx(auVar153,auVar111);
              auVar114 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar114);
              auVar114 = vpermpd_avx2(auVar111,0x4e);
              auVar111 = vminps_avx(auVar111,auVar114);
              auVar111 = vcmpps_avx(auVar153,auVar111,0);
              auVar114 = local_580 & auVar111;
              auVar153 = local_580;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar153 = vandps_avx(auVar111,local_580);
              }
              uVar96 = vmovmskps_avx(auVar153);
              iVar17 = 0;
              for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar90 = iVar17 << 2;
              *(undefined4 *)(local_580 + uVar90) = 0;
              uVar96 = *(uint *)(local_4c0 + uVar90);
              fVar131 = *(float *)(local_440 + uVar90);
              fVar101 = local_ae4;
              if ((float)local_940._0_4_ < 0.0) {
                fVar101 = sqrtf((float)local_940._0_4_);
              }
              auVar266 = ZEXT464(uVar96);
              local_980._0_4_ = fVar101 * 1.9073486e-06;
              lVar94 = 4;
              do {
                fVar163 = auVar266._0_4_;
                fVar101 = 1.0 - fVar163;
                local_9e0._0_16_ = ZEXT416((uint)fVar101);
                auVar133._0_4_ = local_a80._0_4_ * fVar163;
                auVar133._4_4_ = local_a80._4_4_ * fVar163;
                auVar133._8_4_ = local_a80._8_4_ * fVar163;
                auVar133._12_4_ = local_a80._12_4_ * fVar163;
                auVar172._4_4_ = fVar101;
                auVar172._0_4_ = fVar101;
                auVar172._8_4_ = fVar101;
                auVar172._12_4_ = fVar101;
                auVar197 = vfmadd231ps_fma(auVar133,auVar172,local_a60);
                auVar190._0_4_ = local_a70._0_4_ * fVar163;
                auVar190._4_4_ = local_a70._4_4_ * fVar163;
                auVar190._8_4_ = local_a70._8_4_ * fVar163;
                auVar190._12_4_ = local_a70._12_4_ * fVar163;
                auVar216 = vfmadd231ps_fma(auVar190,auVar172,local_a80);
                auVar233._0_4_ = fVar163 * auVar216._0_4_;
                auVar233._4_4_ = fVar163 * auVar216._4_4_;
                auVar233._8_4_ = fVar163 * auVar216._8_4_;
                auVar233._12_4_ = fVar163 * auVar216._12_4_;
                auVar173 = vfmadd231ps_fma(auVar233,auVar172,auVar197);
                auVar134._0_4_ = fVar163 * (float)local_a90._0_4_;
                auVar134._4_4_ = fVar163 * (float)local_a90._4_4_;
                auVar134._8_4_ = fVar163 * fStack_a88;
                auVar134._12_4_ = fVar163 * fStack_a84;
                auVar197 = vfmadd231ps_fma(auVar134,auVar172,local_a70);
                auVar215._0_4_ = fVar163 * auVar197._0_4_;
                auVar215._4_4_ = fVar163 * auVar197._4_4_;
                auVar215._8_4_ = fVar163 * auVar197._8_4_;
                auVar215._12_4_ = fVar163 * auVar197._12_4_;
                auVar216 = vfmadd231ps_fma(auVar215,auVar172,auVar216);
                auVar135._4_4_ = fVar131;
                auVar135._0_4_ = fVar131;
                auVar135._8_4_ = fVar131;
                auVar135._12_4_ = fVar131;
                auVar197 = vfmadd213ps_fma(auVar135,local_930,_DAT_01feba10);
                auVar104._0_4_ = fVar163 * auVar216._0_4_;
                auVar104._4_4_ = fVar163 * auVar216._4_4_;
                auVar104._8_4_ = fVar163 * auVar216._8_4_;
                auVar104._12_4_ = fVar163 * auVar216._12_4_;
                auVar108 = vfmadd231ps_fma(auVar104,auVar173,auVar172);
                local_700._0_16_ = auVar108;
                auVar197 = vsubps_avx(auVar197,auVar108);
                _local_ac0 = auVar197;
                auVar197 = vdpps_avx(auVar197,auVar197,0x7f);
                fVar128 = auVar197._0_4_;
                if (fVar128 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar101);
                  local_a00._0_16_ = auVar173;
                  local_960._0_16_ = auVar216;
                  auVar126._0_4_ = sqrtf(fVar128);
                  auVar126._4_60_ = extraout_var;
                  auVar108 = auVar126._0_16_;
                  auVar216 = local_960._0_16_;
                  auVar173 = local_a00._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar197,auVar197);
                }
                auVar216 = vsubps_avx(auVar216,auVar173);
                auVar245._0_4_ = auVar216._0_4_ * 3.0;
                auVar245._4_4_ = auVar216._4_4_ * 3.0;
                auVar245._8_4_ = auVar216._8_4_ * 3.0;
                auVar245._12_4_ = auVar216._12_4_ * 3.0;
                auVar216 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0._0_16_,
                                           auVar266._0_16_);
                auVar173 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar266._0_16_,
                                           local_9e0._0_16_);
                fVar101 = local_9e0._0_4_ * 6.0;
                fVar168 = auVar216._0_4_ * 6.0;
                fVar164 = auVar173._0_4_ * 6.0;
                fVar129 = fVar163 * 6.0;
                auVar191._0_4_ = fVar129 * (float)local_a90._0_4_;
                auVar191._4_4_ = fVar129 * (float)local_a90._4_4_;
                auVar191._8_4_ = fVar129 * fStack_a88;
                auVar191._12_4_ = fVar129 * fStack_a84;
                auVar136._4_4_ = fVar164;
                auVar136._0_4_ = fVar164;
                auVar136._8_4_ = fVar164;
                auVar136._12_4_ = fVar164;
                auVar216 = vfmadd132ps_fma(auVar136,auVar191,local_a70);
                auVar192._4_4_ = fVar168;
                auVar192._0_4_ = fVar168;
                auVar192._8_4_ = fVar168;
                auVar192._12_4_ = fVar168;
                auVar216 = vfmadd132ps_fma(auVar192,auVar216,local_a80);
                auVar173 = vdpps_avx(auVar245,auVar245,0x7f);
                auVar137._4_4_ = fVar101;
                auVar137._0_4_ = fVar101;
                auVar137._8_4_ = fVar101;
                auVar137._12_4_ = fVar101;
                auVar2 = vfmadd132ps_fma(auVar137,auVar216,local_a60);
                auVar216 = vblendps_avx(auVar173,_DAT_01feba10,0xe);
                auVar282 = vrsqrtss_avx(auVar216,auVar216);
                fVar164 = auVar173._0_4_;
                fVar101 = auVar282._0_4_;
                auVar282 = vdpps_avx(auVar245,auVar2,0x7f);
                fVar101 = fVar101 * 1.5 + fVar164 * -0.5 * fVar101 * fVar101 * fVar101;
                auVar138._0_4_ = auVar2._0_4_ * fVar164;
                auVar138._4_4_ = auVar2._4_4_ * fVar164;
                auVar138._8_4_ = auVar2._8_4_ * fVar164;
                auVar138._12_4_ = auVar2._12_4_ * fVar164;
                fVar168 = auVar282._0_4_;
                auVar234._0_4_ = auVar245._0_4_ * fVar168;
                auVar234._4_4_ = auVar245._4_4_ * fVar168;
                auVar234._8_4_ = auVar245._8_4_ * fVar168;
                auVar234._12_4_ = auVar245._12_4_ * fVar168;
                auVar282 = vsubps_avx(auVar138,auVar234);
                auVar216 = vrcpss_avx(auVar216,auVar216);
                auVar2 = vfnmadd213ss_fma(auVar216,auVar173,ZEXT416(0x40000000));
                fVar168 = auVar216._0_4_ * auVar2._0_4_;
                auVar216 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                      ZEXT416((uint)(fVar131 * (float)local_980._0_4_)));
                auVar213 = ZEXT1664(auVar216);
                uVar98 = CONCAT44(auVar245._4_4_,auVar245._0_4_);
                local_8e0._0_8_ = uVar98 ^ 0x8000000080000000;
                local_8e0._8_4_ = -auVar245._8_4_;
                local_8e0._12_4_ = -auVar245._12_4_;
                auVar193._0_4_ = fVar101 * auVar282._0_4_ * fVar168;
                auVar193._4_4_ = fVar101 * auVar282._4_4_ * fVar168;
                auVar193._8_4_ = fVar101 * auVar282._8_4_ * fVar168;
                auVar193._12_4_ = fVar101 * auVar282._12_4_ * fVar168;
                local_a20._0_4_ = auVar245._0_4_ * fVar101;
                local_a20._4_4_ = auVar245._4_4_ * fVar101;
                local_a20._8_4_ = auVar245._8_4_ * fVar101;
                local_a20._12_4_ = auVar245._12_4_ * fVar101;
                local_9e0._0_16_ = auVar245;
                local_a00._0_4_ = auVar216._0_4_;
                if (fVar164 < -fVar164) {
                  local_960._0_4_ = auVar108._0_4_;
                  local_900._0_16_ = auVar193;
                  fVar101 = sqrtf(fVar164);
                  auVar108 = ZEXT416((uint)local_960._0_4_);
                  auVar213 = ZEXT464((uint)local_a00._0_4_);
                  auVar193 = local_900._0_16_;
                }
                else {
                  auVar216 = vsqrtss_avx(auVar173,auVar173);
                  fVar101 = auVar216._0_4_;
                }
                auVar216 = vdpps_avx(_local_ac0,local_a20._0_16_,0x7f);
                auVar139 = vfmadd213ss_fma(ZEXT416((uint)local_8c0._0_4_),auVar108,auVar213._0_16_);
                auVar173 = vdpps_avx(local_8e0._0_16_,local_a20._0_16_,0x7f);
                auVar282 = vdpps_avx(_local_ac0,auVar193,0x7f);
                auVar2 = vdpps_avx(local_930,local_a20._0_16_,0x7f);
                auVar3 = vfmadd213ss_fma(ZEXT416((uint)(auVar108._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_8c0._0_4_ / fVar101)),auVar139)
                ;
                auVar299 = ZEXT1664(auVar3);
                auVar105._0_4_ = auVar216._0_4_ * auVar216._0_4_;
                auVar105._4_4_ = auVar216._4_4_ * auVar216._4_4_;
                auVar105._8_4_ = auVar216._8_4_ * auVar216._8_4_;
                auVar105._12_4_ = auVar216._12_4_ * auVar216._12_4_;
                auVar108 = vdpps_avx(_local_ac0,local_8e0._0_16_,0x7f);
                auVar149 = vsubps_avx(auVar197,auVar105);
                auVar139 = vrsqrtss_avx(auVar149,auVar149);
                fVar168 = auVar149._0_4_;
                fVar101 = auVar139._0_4_;
                fVar101 = fVar101 * 1.5 + fVar168 * -0.5 * fVar101 * fVar101 * fVar101;
                auVar139 = vdpps_avx(_local_ac0,local_930,0x7f);
                local_960._0_16_ = ZEXT416((uint)(auVar173._0_4_ + auVar282._0_4_));
                local_a20._0_16_ = vfnmadd231ss_fma(auVar108,auVar216,local_960._0_16_);
                local_8e0._0_16_ = auVar2;
                auVar173 = vfnmadd231ss_fma(auVar139,auVar216,auVar2);
                if (fVar168 < 0.0) {
                  local_900._0_16_ = auVar216;
                  local_740._0_4_ = auVar3._0_4_;
                  local_760._0_4_ = fVar101;
                  local_780._0_16_ = auVar173;
                  fVar168 = sqrtf(fVar168);
                  auVar299 = ZEXT464((uint)local_740._0_4_);
                  auVar213 = ZEXT464((uint)local_a00._0_4_);
                  fVar101 = (float)local_760._0_4_;
                  auVar173 = local_780._0_16_;
                  auVar216 = local_900._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar149,auVar149);
                  fVar168 = auVar108._0_4_;
                }
                auVar257 = ZEXT3264(local_9a0);
                auVar269 = ZEXT3264(local_ae0);
                auVar276 = ZEXT1664(local_9e0._0_16_);
                auVar108 = vpermilps_avx(local_700._0_16_,0xff);
                auVar2 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
                auVar282 = vfmsub213ss_fma(local_a20._0_16_,ZEXT416((uint)fVar101),auVar2);
                auVar194._0_8_ = local_8e0._0_8_ ^ 0x8000000080000000;
                auVar194._8_4_ = local_8e0._8_4_ ^ 0x80000000;
                auVar194._12_4_ = local_8e0._12_4_ ^ 0x80000000;
                auVar217._0_8_ = auVar282._0_8_ ^ 0x8000000080000000;
                auVar217._8_4_ = auVar282._8_4_ ^ 0x80000000;
                auVar217._12_4_ = auVar282._12_4_ ^ 0x80000000;
                auVar173 = ZEXT416((uint)(auVar173._0_4_ * fVar101));
                auVar282 = vfmsub231ss_fma(ZEXT416((uint)(local_8e0._0_4_ * auVar282._0_4_)),
                                           local_960._0_16_,auVar173);
                auVar173 = vinsertps_avx(auVar173,auVar194,0x10);
                uVar97 = auVar282._0_4_;
                auVar195._4_4_ = uVar97;
                auVar195._0_4_ = uVar97;
                auVar195._8_4_ = uVar97;
                auVar195._12_4_ = uVar97;
                auVar173 = vdivps_avx(auVar173,auVar195);
                auVar139 = ZEXT416((uint)(fVar168 - auVar108._0_4_));
                auVar282 = vinsertps_avx(auVar216,auVar139,0x10);
                auVar243 = ZEXT1664(auVar282);
                auVar174._0_4_ = auVar282._0_4_ * auVar173._0_4_;
                auVar174._4_4_ = auVar282._4_4_ * auVar173._4_4_;
                auVar174._8_4_ = auVar282._8_4_ * auVar173._8_4_;
                auVar174._12_4_ = auVar282._12_4_ * auVar173._12_4_;
                auVar173 = vinsertps_avx(auVar217,local_960._0_16_,0x1c);
                auVar173 = vdivps_avx(auVar173,auVar195);
                auVar196._0_4_ = auVar282._0_4_ * auVar173._0_4_;
                auVar196._4_4_ = auVar282._4_4_ * auVar173._4_4_;
                auVar196._8_4_ = auVar282._8_4_ * auVar173._8_4_;
                auVar196._12_4_ = auVar282._12_4_ * auVar173._12_4_;
                auVar173 = vhaddps_avx(auVar174,auVar174);
                auVar108 = vhaddps_avx(auVar196,auVar196);
                fVar163 = fVar163 - auVar173._0_4_;
                auVar266 = ZEXT464((uint)fVar163);
                fVar131 = fVar131 - auVar108._0_4_;
                auVar216 = vandps_avx(auVar216,local_720._0_16_);
                if (auVar299._0_4_ <= auVar216._0_4_) {
LAB_0198224d:
                  bVar47 = false;
                }
                else {
                  auVar173 = vfmadd231ss_fma(ZEXT416((uint)(auVar213._0_4_ + auVar299._0_4_)),
                                             _local_7c0,ZEXT416(0x36000000));
                  auVar216 = vandps_avx(auVar139,local_720._0_16_);
                  if (auVar173._0_4_ <= auVar216._0_4_) goto LAB_0198224d;
                  fVar131 = fVar131 + (float)local_880._0_4_;
                  bVar47 = true;
                  if ((((fVar100 <= fVar131) &&
                       (fVar101 = *(float *)(ray + k * 4 + 0x80), fVar131 <= fVar101)) &&
                      (0.0 <= fVar163)) && (fVar163 <= 1.0)) {
                    auVar197 = vrsqrtss_avx(auVar197,auVar197);
                    fVar168 = auVar197._0_4_;
                    auVar95 = (undefined1  [8])(context->scene->geometries).items[uVar89].ptr;
                    if ((((Geometry *)auVar95)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar128 = fVar168 * 1.5 + fVar128 * -0.5 * fVar168 * fVar168 * fVar168;
                      auVar140._0_4_ = fVar128 * (float)local_ac0._0_4_;
                      auVar140._4_4_ = fVar128 * (float)local_ac0._4_4_;
                      auVar140._8_4_ = fVar128 * fStack_ab8;
                      auVar140._12_4_ = fVar128 * fStack_ab4;
                      auVar108 = vfmadd213ps_fma(auVar2,auVar140,local_9e0._0_16_);
                      auVar197 = vshufps_avx(auVar140,auVar140,0xc9);
                      auVar216 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                      auVar141._0_4_ = auVar140._0_4_ * auVar216._0_4_;
                      auVar141._4_4_ = auVar140._4_4_ * auVar216._4_4_;
                      auVar141._8_4_ = auVar140._8_4_ * auVar216._8_4_;
                      auVar141._12_4_ = auVar140._12_4_ * auVar216._12_4_;
                      auVar173 = vfmsub231ps_fma(auVar141,local_9e0._0_16_,auVar197);
                      auVar197 = vshufps_avx(auVar173,auVar173,0xc9);
                      auVar216 = vshufps_avx(auVar108,auVar108,0xc9);
                      auVar173 = vshufps_avx(auVar173,auVar173,0xd2);
                      auVar106._0_4_ = auVar108._0_4_ * auVar173._0_4_;
                      auVar106._4_4_ = auVar108._4_4_ * auVar173._4_4_;
                      auVar106._8_4_ = auVar108._8_4_ * auVar173._8_4_;
                      auVar106._12_4_ = auVar108._12_4_ * auVar173._12_4_;
                      auVar197 = vfmsub231ps_fma(auVar106,auVar197,auVar216);
                      uVar97 = auVar197._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar95)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar131;
                        uVar5 = vextractps_avx(auVar197,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar5;
                        uVar5 = vextractps_avx(auVar197,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar5;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar97;
                        *(float *)(ray + k * 4 + 0xf0) = fVar163;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9a8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar89;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6c0 = (RTCHitN  [16])vshufps_avx(auVar197,auVar197,0x55);
                        auVar197 = vshufps_avx(auVar197,auVar197,0xaa);
                        auStack_6b0 = auVar197;
                        local_6a0 = uVar97;
                        uStack_69c = uVar97;
                        uStack_698 = uVar97;
                        uStack_694 = uVar97;
                        local_690 = fVar163;
                        fStack_68c = fVar163;
                        fStack_688 = fVar163;
                        fStack_684 = fVar163;
                        local_680 = ZEXT416(0) << 0x20;
                        local_670 = CONCAT44(uStack_6dc,local_6e0);
                        uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                        local_660._4_4_ = uStack_6cc;
                        local_660._0_4_ = local_6d0;
                        local_660._8_4_ = uStack_6c8;
                        local_660._12_4_ = uStack_6c4;
                        vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                        uStack_64c = context->user->instID[0];
                        local_650 = uStack_64c;
                        uStack_648 = uStack_64c;
                        uStack_644 = uStack_64c;
                        uStack_640 = context->user->instPrimID[0];
                        uStack_63c = uStack_640;
                        uStack_638 = uStack_640;
                        uStack_634 = uStack_640;
                        *(float *)(ray + k * 4 + 0x80) = fVar131;
                        local_b00 = *local_9b0;
                        uStack_af8 = local_9b0[1];
                        local_a50.valid = (int *)&local_b00;
                        local_a50.geometryUserPtr = ((Geometry *)auVar95)->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_6c0;
                        local_a50.N = 4;
                        local_a50.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar95)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_ac0 = auVar95;
                          auVar243 = ZEXT1664(auVar282);
                          auVar276 = ZEXT1664(local_9e0._0_16_);
                          auVar299 = ZEXT1664(auVar299._0_16_);
                          (*((Geometry *)auVar95)->intersectionFilterN)(&local_a50);
                          auVar266 = ZEXT1664(ZEXT416((uint)fVar163));
                          auVar269 = ZEXT3264(local_ae0);
                          auVar257 = ZEXT3264(local_9a0);
                          auVar95 = local_ac0;
                        }
                        auVar70._8_8_ = uStack_af8;
                        auVar70._0_8_ = local_b00;
                        if (auVar70 == (undefined1  [16])0x0) {
                          auVar197 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar197 = auVar197 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar95)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar243 = ZEXT1664(auVar243._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            auVar299 = ZEXT1664(auVar299._0_16_);
                            (*p_Var11)(&local_a50);
                            auVar266 = ZEXT1664(ZEXT416((uint)fVar163));
                            auVar269 = ZEXT3264(local_ae0);
                            auVar257 = ZEXT3264(local_9a0);
                          }
                          auVar71._8_8_ = uStack_af8;
                          auVar71._0_8_ = local_b00;
                          auVar216 = vpcmpeqd_avx(auVar71,_DAT_01feba10);
                          auVar173 = vpcmpeqd_avx(auVar197,auVar197);
                          auVar197 = auVar216 ^ auVar173;
                          if (auVar71 != (undefined1  [16])0x0) {
                            auVar216 = auVar216 ^ auVar173;
                            auVar173 = vmaskmovps_avx(auVar216,*(undefined1 (*) [16])local_a50.hit);
                            *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar173;
                            auVar173 = vmaskmovps_avx(auVar216,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x10));
                            *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar173;
                            auVar173 = vmaskmovps_avx(auVar216,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x20));
                            *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar173;
                            auVar173 = vmaskmovps_avx(auVar216,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x30));
                            *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar173;
                            auVar173 = vmaskmovps_avx(auVar216,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x40));
                            *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar173;
                            auVar173 = vmaskmovps_avx(auVar216,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x50));
                            *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar173;
                            auVar173 = vmaskmovps_avx(auVar216,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x60));
                            *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar173;
                            auVar173 = vmaskmovps_avx(auVar216,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x70));
                            *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar173;
                            auVar216 = vmaskmovps_avx(auVar216,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x80));
                            *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar216;
                          }
                        }
                        auVar142._8_8_ = 0x100000001;
                        auVar142._0_8_ = 0x100000001;
                        if ((auVar142 & auVar197) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar101;
                        }
                      }
                    }
                  }
                }
                auVar153 = local_580;
                bVar99 = lVar94 != 0;
                lVar94 = lVar94 + -1;
              } while ((!bVar47) && (bVar99));
              uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar122._4_4_ = uVar97;
              auVar122._0_4_ = uVar97;
              auVar122._8_4_ = uVar97;
              auVar122._12_4_ = uVar97;
              auVar122._16_4_ = uVar97;
              auVar122._20_4_ = uVar97;
              auVar122._24_4_ = uVar97;
              auVar122._28_4_ = uVar97;
              auVar111 = vcmpps_avx(_local_800,auVar122,2);
              local_580 = vandps_avx(auVar111,local_580);
              auVar153 = auVar153 & auVar111;
              auVar271 = ZEXT3264(auVar257._0_32_);
              uVar98 = local_5c0._0_8_;
            } while ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar153 >> 0x7f,0) != '\0') ||
                       (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar153 >> 0xbf,0) != '\0') ||
                     (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar153[0x1f] < '\0');
          }
          auVar62._4_4_ = (float)local_600._4_4_ * (float)local_840._4_4_;
          auVar62._0_4_ = (float)local_600._0_4_ * (float)local_840._0_4_;
          auVar62._8_4_ = fStack_5f8 * fStack_838;
          auVar62._12_4_ = fStack_5f4 * fStack_834;
          auVar62._16_4_ = fStack_5f0 * fStack_830;
          auVar62._20_4_ = fStack_5ec * fStack_82c;
          auVar62._24_4_ = fStack_5e8 * fStack_828;
          auVar62._28_4_ = uStack_5e4;
          auVar197 = vfmadd132ps_fma(_local_5e0,auVar62,_local_820);
          auVar197 = vfmadd132ps_fma(local_860,ZEXT1632(auVar197),_local_7e0);
          auVar153 = vandps_avx(ZEXT1632(auVar197),local_920);
          auVar158._8_4_ = 0x3e99999a;
          auVar158._0_8_ = 0x3e99999a3e99999a;
          auVar158._12_4_ = 0x3e99999a;
          auVar158._16_4_ = 0x3e99999a;
          auVar158._20_4_ = 0x3e99999a;
          auVar158._24_4_ = 0x3e99999a;
          auVar158._28_4_ = 0x3e99999a;
          auVar153 = vcmpps_avx(auVar153,auVar158,1);
          auVar111 = vorps_avx(auVar153,local_560);
          auVar159._0_4_ = auVar269._0_4_ + (float)local_7a0._0_4_;
          auVar159._4_4_ = auVar269._4_4_ + (float)local_7a0._4_4_;
          auVar159._8_4_ = auVar269._8_4_ + fStack_798;
          auVar159._12_4_ = auVar269._12_4_ + fStack_794;
          auVar159._16_4_ = auVar269._16_4_ + fStack_790;
          auVar159._20_4_ = auVar269._20_4_ + fStack_78c;
          auVar159._24_4_ = auVar269._24_4_ + fStack_788;
          auVar159._28_4_ = auVar269._28_4_ + fStack_784;
          uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar182._4_4_ = uVar97;
          auVar182._0_4_ = uVar97;
          auVar182._8_4_ = uVar97;
          auVar182._12_4_ = uVar97;
          auVar182._16_4_ = uVar97;
          auVar182._20_4_ = uVar97;
          auVar182._24_4_ = uVar97;
          auVar182._28_4_ = uVar97;
          auVar153 = vcmpps_avx(auVar159,auVar182,2);
          _local_800 = vandps_avx(auVar153,local_540);
          auVar160._8_4_ = 3;
          auVar160._0_8_ = 0x300000003;
          auVar160._12_4_ = 3;
          auVar160._16_4_ = 3;
          auVar160._20_4_ = 3;
          auVar160._24_4_ = 3;
          auVar160._28_4_ = 3;
          auVar183._8_4_ = 2;
          auVar183._0_8_ = 0x200000002;
          auVar183._12_4_ = 2;
          auVar183._16_4_ = 2;
          auVar183._20_4_ = 2;
          auVar183._24_4_ = 2;
          auVar183._28_4_ = 2;
          auVar153 = vblendvps_avx(auVar183,auVar160,auVar111);
          local_860 = vpcmpgtd_avx2(auVar153,local_620);
          local_5a0 = vpandn_avx2(local_860,_local_800);
          auVar153 = _local_800 & ~local_860;
          if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar153 >> 0x7f,0) != '\0') ||
                (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar153 >> 0xbf,0) != '\0') ||
              (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar153[0x1f] < '\0') {
            auVar216 = vminps_avx(local_a60,local_a80);
            auVar197 = vmaxps_avx(local_a60,local_a80);
            auVar173 = vminps_avx(local_a70,_local_a90);
            auVar108 = vminps_avx(auVar216,auVar173);
            auVar216 = vmaxps_avx(local_a70,_local_a90);
            auVar173 = vmaxps_avx(auVar197,auVar216);
            local_8e0._8_4_ = NAN;
            local_8e0._0_8_ = 0x7fffffff7fffffff;
            local_8e0._12_4_ = NAN;
            auVar197 = vandps_avx(auVar108,local_8e0._0_16_);
            auVar216 = vandps_avx(auVar173,local_8e0._0_16_);
            auVar197 = vmaxps_avx(auVar197,auVar216);
            auVar216 = vmovshdup_avx(auVar197);
            auVar216 = vmaxss_avx(auVar216,auVar197);
            auVar197 = vshufpd_avx(auVar197,auVar197,1);
            auVar197 = vmaxss_avx(auVar197,auVar216);
            local_8c0._0_4_ = auVar197._0_4_ * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar173,auVar173,0xff);
            local_780 = _local_400;
            local_7c0._4_4_ = (float)local_400._4_4_ + (float)local_7a0._4_4_;
            local_7c0._0_4_ = (float)local_400._0_4_ + (float)local_7a0._0_4_;
            fStack_7b8 = fStack_3f8 + fStack_798;
            fStack_7b4 = fStack_3f4 + fStack_794;
            auStack_7b0._0_4_ = fStack_3f0 + fStack_790;
            auStack_7b0._4_4_ = fStack_3ec + fStack_78c;
            fStack_7a8 = fStack_3e8 + fStack_788;
            fStack_7a4 = fStack_3e4 + fStack_784;
            do {
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar153 = vblendvps_avx(auVar161,local_780,local_5a0);
              auVar111 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar111 = vminps_avx(auVar153,auVar111);
              auVar114 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar114);
              auVar114 = vpermpd_avx2(auVar111,0x4e);
              auVar111 = vminps_avx(auVar111,auVar114);
              auVar111 = vcmpps_avx(auVar153,auVar111,0);
              auVar114 = local_5a0 & auVar111;
              auVar153 = local_5a0;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar153 = vandps_avx(auVar111,local_5a0);
              }
              uVar96 = vmovmskps_avx(auVar153);
              iVar17 = 0;
              for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar90 = iVar17 << 2;
              *(undefined4 *)(local_5a0 + uVar90) = 0;
              uVar96 = *(uint *)(local_4e0 + uVar90);
              uVar90 = *(uint *)(local_3e0 + uVar90);
              fVar131 = local_ae8;
              if ((float)local_940._0_4_ < 0.0) {
                fVar131 = sqrtf((float)local_940._0_4_);
              }
              auVar257 = ZEXT464(uVar90);
              auVar213 = ZEXT464(uVar96);
              local_960._0_4_ = fVar131 * 1.9073486e-06;
              lVar94 = 4;
              do {
                fVar163 = auVar213._0_4_;
                fVar101 = 1.0 - fVar163;
                local_9e0._0_16_ = ZEXT416((uint)fVar101);
                auVar143._0_4_ = local_a80._0_4_ * fVar163;
                auVar143._4_4_ = local_a80._4_4_ * fVar163;
                auVar143._8_4_ = local_a80._8_4_ * fVar163;
                auVar143._12_4_ = local_a80._12_4_ * fVar163;
                auVar175._4_4_ = fVar101;
                auVar175._0_4_ = fVar101;
                auVar175._8_4_ = fVar101;
                auVar175._12_4_ = fVar101;
                auVar197 = vfmadd231ps_fma(auVar143,auVar175,local_a60);
                auVar198._0_4_ = local_a70._0_4_ * fVar163;
                auVar198._4_4_ = local_a70._4_4_ * fVar163;
                auVar198._8_4_ = local_a70._8_4_ * fVar163;
                auVar198._12_4_ = local_a70._12_4_ * fVar163;
                auVar216 = vfmadd231ps_fma(auVar198,auVar175,local_a80);
                auVar235._0_4_ = fVar163 * auVar216._0_4_;
                auVar235._4_4_ = fVar163 * auVar216._4_4_;
                auVar235._8_4_ = fVar163 * auVar216._8_4_;
                auVar235._12_4_ = fVar163 * auVar216._12_4_;
                auVar173 = vfmadd231ps_fma(auVar235,auVar175,auVar197);
                auVar144._0_4_ = fVar163 * (float)local_a90._0_4_;
                auVar144._4_4_ = fVar163 * (float)local_a90._4_4_;
                auVar144._8_4_ = fVar163 * fStack_a88;
                auVar144._12_4_ = fVar163 * fStack_a84;
                auVar197 = vfmadd231ps_fma(auVar144,auVar175,local_a70);
                auVar218._0_4_ = fVar163 * auVar197._0_4_;
                auVar218._4_4_ = fVar163 * auVar197._4_4_;
                auVar218._8_4_ = fVar163 * auVar197._8_4_;
                auVar218._12_4_ = fVar163 * auVar197._12_4_;
                auVar216 = vfmadd231ps_fma(auVar218,auVar175,auVar216);
                fVar131 = auVar257._0_4_;
                auVar145._4_4_ = fVar131;
                auVar145._0_4_ = fVar131;
                auVar145._8_4_ = fVar131;
                auVar145._12_4_ = fVar131;
                auVar197 = vfmadd213ps_fma(auVar145,local_930,_DAT_01feba10);
                auVar107._0_4_ = fVar163 * auVar216._0_4_;
                auVar107._4_4_ = fVar163 * auVar216._4_4_;
                auVar107._8_4_ = fVar163 * auVar216._8_4_;
                auVar107._12_4_ = fVar163 * auVar216._12_4_;
                auVar108 = vfmadd231ps_fma(auVar107,auVar173,auVar175);
                local_700._0_16_ = auVar108;
                auVar197 = vsubps_avx(auVar197,auVar108);
                _local_ac0 = auVar197;
                auVar197 = vdpps_avx(auVar197,auVar197,0x7f);
                fVar128 = auVar197._0_4_;
                if (fVar128 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar101);
                  local_a00._0_16_ = auVar173;
                  local_a20._0_16_ = auVar216;
                  auVar127._0_4_ = sqrtf(fVar128);
                  auVar127._4_60_ = extraout_var_00;
                  auVar108 = auVar127._0_16_;
                  auVar216 = local_a20._0_16_;
                  auVar173 = local_a00._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar197,auVar197);
                }
                auVar216 = vsubps_avx(auVar216,auVar173);
                auVar260._0_4_ = auVar216._0_4_ * 3.0;
                auVar260._4_4_ = auVar216._4_4_ * 3.0;
                auVar260._8_4_ = auVar216._8_4_ * 3.0;
                auVar260._12_4_ = auVar216._12_4_ * 3.0;
                auVar216 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0._0_16_,
                                           auVar213._0_16_);
                auVar173 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar213._0_16_,
                                           local_9e0._0_16_);
                fVar101 = local_9e0._0_4_ * 6.0;
                fVar168 = auVar216._0_4_ * 6.0;
                fVar164 = auVar173._0_4_ * 6.0;
                fVar129 = fVar163 * 6.0;
                auVar199._0_4_ = fVar129 * (float)local_a90._0_4_;
                auVar199._4_4_ = fVar129 * (float)local_a90._4_4_;
                auVar199._8_4_ = fVar129 * fStack_a88;
                auVar199._12_4_ = fVar129 * fStack_a84;
                auVar146._4_4_ = fVar164;
                auVar146._0_4_ = fVar164;
                auVar146._8_4_ = fVar164;
                auVar146._12_4_ = fVar164;
                auVar216 = vfmadd132ps_fma(auVar146,auVar199,local_a70);
                auVar200._4_4_ = fVar168;
                auVar200._0_4_ = fVar168;
                auVar200._8_4_ = fVar168;
                auVar200._12_4_ = fVar168;
                auVar216 = vfmadd132ps_fma(auVar200,auVar216,local_a80);
                auVar173 = vdpps_avx(auVar260,auVar260,0x7f);
                auVar147._4_4_ = fVar101;
                auVar147._0_4_ = fVar101;
                auVar147._8_4_ = fVar101;
                auVar147._12_4_ = fVar101;
                auVar2 = vfmadd132ps_fma(auVar147,auVar216,local_a60);
                auVar216 = vblendps_avx(auVar173,_DAT_01feba10,0xe);
                auVar282 = vrsqrtss_avx(auVar216,auVar216);
                fVar164 = auVar173._0_4_;
                fVar101 = auVar282._0_4_;
                auVar282 = vdpps_avx(auVar260,auVar2,0x7f);
                fVar101 = fVar101 * 1.5 + fVar164 * -0.5 * fVar101 * fVar101 * fVar101;
                auVar148._0_4_ = auVar2._0_4_ * fVar164;
                auVar148._4_4_ = auVar2._4_4_ * fVar164;
                auVar148._8_4_ = auVar2._8_4_ * fVar164;
                auVar148._12_4_ = auVar2._12_4_ * fVar164;
                fVar168 = auVar282._0_4_;
                auVar236._0_4_ = auVar260._0_4_ * fVar168;
                auVar236._4_4_ = auVar260._4_4_ * fVar168;
                auVar236._8_4_ = auVar260._8_4_ * fVar168;
                auVar236._12_4_ = auVar260._12_4_ * fVar168;
                auVar282 = vsubps_avx(auVar148,auVar236);
                auVar216 = vrcpss_avx(auVar216,auVar216);
                auVar2 = vfnmadd213ss_fma(auVar216,auVar173,ZEXT416(0x40000000));
                fVar168 = auVar216._0_4_ * auVar2._0_4_;
                auVar216 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                      ZEXT416((uint)(fVar131 * (float)local_960._0_4_)));
                auVar271 = ZEXT1664(auVar216);
                uVar98 = CONCAT44(auVar260._4_4_,auVar260._0_4_);
                auVar246._0_8_ = uVar98 ^ 0x8000000080000000;
                auVar246._8_4_ = -auVar260._8_4_;
                auVar246._12_4_ = -auVar260._12_4_;
                auVar201._0_4_ = fVar101 * auVar282._0_4_ * fVar168;
                auVar201._4_4_ = fVar101 * auVar282._4_4_ * fVar168;
                auVar201._8_4_ = fVar101 * auVar282._8_4_ * fVar168;
                auVar201._12_4_ = fVar101 * auVar282._12_4_ * fVar168;
                auVar250._0_4_ = auVar260._0_4_ * fVar101;
                auVar250._4_4_ = auVar260._4_4_ * fVar101;
                auVar250._8_4_ = auVar260._8_4_ * fVar101;
                auVar250._12_4_ = auVar260._12_4_ * fVar101;
                local_9e0._0_16_ = auVar260;
                local_a00._0_4_ = auVar216._0_4_;
                if (fVar164 < -fVar164) {
                  local_a20._0_4_ = auVar108._0_4_;
                  local_980._0_16_ = auVar246;
                  local_9a0._0_16_ = auVar250;
                  local_ae0._0_16_ = auVar201;
                  fVar101 = sqrtf(fVar164);
                  auVar108 = ZEXT416((uint)local_a20._0_4_);
                  auVar271 = ZEXT464((uint)local_a00._0_4_);
                  auVar201 = local_ae0._0_16_;
                  auVar246 = local_980._0_16_;
                  auVar250 = local_9a0._0_16_;
                }
                else {
                  auVar216 = vsqrtss_avx(auVar173,auVar173);
                  fVar101 = auVar216._0_4_;
                }
                auVar216 = vdpps_avx(_local_ac0,auVar250,0x7f);
                auVar139 = vfmadd213ss_fma(ZEXT416((uint)local_8c0._0_4_),auVar108,auVar271._0_16_);
                auVar173 = vdpps_avx(auVar246,auVar250,0x7f);
                auVar282 = vdpps_avx(_local_ac0,auVar201,0x7f);
                auVar2 = vdpps_avx(local_930,auVar250,0x7f);
                auVar139 = vfmadd213ss_fma(ZEXT416((uint)(auVar108._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_8c0._0_4_ / fVar101)),
                                           auVar139);
                auVar276 = ZEXT1664(auVar139);
                fVar101 = auVar173._0_4_ + auVar282._0_4_;
                auVar109._0_4_ = auVar216._0_4_ * auVar216._0_4_;
                auVar109._4_4_ = auVar216._4_4_ * auVar216._4_4_;
                auVar109._8_4_ = auVar216._8_4_ * auVar216._8_4_;
                auVar109._12_4_ = auVar216._12_4_ * auVar216._12_4_;
                auVar173 = vdpps_avx(_local_ac0,auVar246,0x7f);
                auVar282 = vsubps_avx(auVar197,auVar109);
                auVar108 = vrsqrtss_avx(auVar282,auVar282);
                fVar164 = auVar282._0_4_;
                fVar168 = auVar108._0_4_;
                fVar168 = fVar168 * 1.5 + fVar164 * -0.5 * fVar168 * fVar168 * fVar168;
                auVar108 = vdpps_avx(_local_ac0,local_930,0x7f);
                auVar173 = vfnmadd231ss_fma(auVar173,auVar216,ZEXT416((uint)fVar101));
                auVar108 = vfnmadd231ss_fma(auVar108,auVar216,auVar2);
                if (fVar164 < 0.0) {
                  local_a20._0_16_ = auVar216;
                  local_980._0_4_ = auVar139._0_4_;
                  local_9a0._0_16_ = ZEXT416((uint)fVar101);
                  local_ae0._0_16_ = auVar2;
                  local_720._0_16_ = auVar173;
                  local_900._0_4_ = fVar168;
                  local_740._0_16_ = auVar108;
                  fVar164 = sqrtf(fVar164);
                  auVar276 = ZEXT464((uint)local_980._0_4_);
                  auVar271 = ZEXT464((uint)local_a00._0_4_);
                  fVar168 = (float)local_900._0_4_;
                  auVar108 = local_740._0_16_;
                  auVar216 = local_a20._0_16_;
                  auVar2 = local_ae0._0_16_;
                  auVar173 = local_720._0_16_;
                  auVar282 = local_9a0._0_16_;
                }
                else {
                  auVar282 = vsqrtss_avx(auVar282,auVar282);
                  fVar164 = auVar282._0_4_;
                  auVar282 = ZEXT416((uint)fVar101);
                }
                auVar269 = ZEXT1664(auVar197);
                auVar266 = ZEXT1664(local_9e0._0_16_);
                auVar149 = vpermilps_avx(local_700._0_16_,0xff);
                auVar139 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
                auVar3 = vfmsub213ss_fma(auVar173,ZEXT416((uint)fVar168),auVar139);
                auVar299 = ZEXT1664(auVar3);
                auVar202._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
                auVar202._8_4_ = auVar2._8_4_ ^ 0x80000000;
                auVar202._12_4_ = auVar2._12_4_ ^ 0x80000000;
                auVar219._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar219._8_4_ = auVar3._8_4_ ^ 0x80000000;
                auVar219._12_4_ = auVar3._12_4_ ^ 0x80000000;
                auVar173 = ZEXT416((uint)(auVar108._0_4_ * fVar168));
                auVar108 = vfmsub231ss_fma(ZEXT416((uint)(auVar2._0_4_ * auVar3._0_4_)),auVar282,
                                           auVar173);
                auVar173 = vinsertps_avx(auVar173,auVar202,0x10);
                uVar97 = auVar108._0_4_;
                auVar203._4_4_ = uVar97;
                auVar203._0_4_ = uVar97;
                auVar203._8_4_ = uVar97;
                auVar203._12_4_ = uVar97;
                auVar173 = vdivps_avx(auVar173,auVar203);
                auVar149 = ZEXT416((uint)(fVar164 - auVar149._0_4_));
                auVar2 = vinsertps_avx(auVar216,auVar149,0x10);
                auVar243 = ZEXT1664(auVar2);
                auVar176._0_4_ = auVar2._0_4_ * auVar173._0_4_;
                auVar176._4_4_ = auVar2._4_4_ * auVar173._4_4_;
                auVar176._8_4_ = auVar2._8_4_ * auVar173._8_4_;
                auVar176._12_4_ = auVar2._12_4_ * auVar173._12_4_;
                auVar173 = vinsertps_avx(auVar219,auVar282,0x1c);
                auVar173 = vdivps_avx(auVar173,auVar203);
                auVar204._0_4_ = auVar2._0_4_ * auVar173._0_4_;
                auVar204._4_4_ = auVar2._4_4_ * auVar173._4_4_;
                auVar204._8_4_ = auVar2._8_4_ * auVar173._8_4_;
                auVar204._12_4_ = auVar2._12_4_ * auVar173._12_4_;
                auVar173 = vhaddps_avx(auVar176,auVar176);
                auVar108 = vhaddps_avx(auVar204,auVar204);
                fVar163 = fVar163 - auVar173._0_4_;
                auVar213 = ZEXT464((uint)fVar163);
                fVar131 = fVar131 - auVar108._0_4_;
                auVar257 = ZEXT464((uint)fVar131);
                auVar216 = vandps_avx(auVar216,local_8e0._0_16_);
                if (auVar276._0_4_ <= auVar216._0_4_) {
LAB_01982db3:
                  bVar47 = false;
                }
                else {
                  auVar173 = vfmadd231ss_fma(ZEXT416((uint)(auVar271._0_4_ + auVar276._0_4_)),
                                             local_760._0_16_,ZEXT416(0x36000000));
                  auVar216 = vandps_avx(auVar149,local_8e0._0_16_);
                  if (auVar173._0_4_ <= auVar216._0_4_) goto LAB_01982db3;
                  fVar131 = fVar131 + (float)local_880._0_4_;
                  auVar257 = ZEXT464((uint)fVar131);
                  bVar47 = true;
                  if ((((fVar100 <= fVar131) &&
                       (fVar101 = *(float *)(ray + k * 4 + 0x80), fVar131 <= fVar101)) &&
                      (0.0 <= fVar163)) && (fVar163 <= 1.0)) {
                    auVar216 = vrsqrtss_avx(auVar197,auVar197);
                    fVar168 = auVar216._0_4_;
                    auVar95 = (undefined1  [8])(context->scene->geometries).items[uVar89].ptr;
                    if ((((Geometry *)auVar95)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar128 = fVar168 * 1.5 + fVar128 * -0.5 * fVar168 * fVar168 * fVar168;
                      auVar150._0_4_ = fVar128 * (float)local_ac0._0_4_;
                      auVar150._4_4_ = fVar128 * (float)local_ac0._4_4_;
                      auVar150._8_4_ = fVar128 * fStack_ab8;
                      auVar150._12_4_ = fVar128 * fStack_ab4;
                      auVar282 = vfmadd213ps_fma(auVar139,auVar150,local_9e0._0_16_);
                      auVar216 = vshufps_avx(auVar150,auVar150,0xc9);
                      auVar173 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                      auVar151._0_4_ = auVar150._0_4_ * auVar173._0_4_;
                      auVar151._4_4_ = auVar150._4_4_ * auVar173._4_4_;
                      auVar151._8_4_ = auVar150._8_4_ * auVar173._8_4_;
                      auVar151._12_4_ = auVar150._12_4_ * auVar173._12_4_;
                      auVar108 = vfmsub231ps_fma(auVar151,local_9e0._0_16_,auVar216);
                      auVar216 = vshufps_avx(auVar108,auVar108,0xc9);
                      auVar173 = vshufps_avx(auVar282,auVar282,0xc9);
                      auVar108 = vshufps_avx(auVar108,auVar108,0xd2);
                      auVar110._0_4_ = auVar282._0_4_ * auVar108._0_4_;
                      auVar110._4_4_ = auVar282._4_4_ * auVar108._4_4_;
                      auVar110._8_4_ = auVar282._8_4_ * auVar108._8_4_;
                      auVar110._12_4_ = auVar282._12_4_ * auVar108._12_4_;
                      auVar216 = vfmsub231ps_fma(auVar110,auVar216,auVar173);
                      uVar97 = auVar216._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar95)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar131;
                        uVar5 = vextractps_avx(auVar216,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar5;
                        uVar5 = vextractps_avx(auVar216,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar5;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar97;
                        *(float *)(ray + k * 4 + 0xf0) = fVar163;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9a8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar89;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6c0 = (RTCHitN  [16])vshufps_avx(auVar216,auVar216,0x55);
                        auVar216 = vshufps_avx(auVar216,auVar216,0xaa);
                        auStack_6b0 = auVar216;
                        local_6a0 = uVar97;
                        uStack_69c = uVar97;
                        uStack_698 = uVar97;
                        uStack_694 = uVar97;
                        local_690 = fVar163;
                        fStack_68c = fVar163;
                        fStack_688 = fVar163;
                        fStack_684 = fVar163;
                        local_680 = ZEXT416(0) << 0x20;
                        local_670 = CONCAT44(uStack_6dc,local_6e0);
                        uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                        local_660._4_4_ = uStack_6cc;
                        local_660._0_4_ = local_6d0;
                        local_660._8_4_ = uStack_6c8;
                        local_660._12_4_ = uStack_6c4;
                        vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                        uStack_64c = context->user->instID[0];
                        local_650 = uStack_64c;
                        uStack_648 = uStack_64c;
                        uStack_644 = uStack_64c;
                        uStack_640 = context->user->instPrimID[0];
                        uStack_63c = uStack_640;
                        uStack_638 = uStack_640;
                        uStack_634 = uStack_640;
                        *(float *)(ray + k * 4 + 0x80) = fVar131;
                        local_b00 = *local_9b0;
                        uStack_af8 = local_9b0[1];
                        local_a50.valid = (int *)&local_b00;
                        local_a50.geometryUserPtr = ((Geometry *)auVar95)->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_6c0;
                        local_a50.N = 4;
                        local_a50.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar95)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_ac0 = auVar95;
                          auVar243 = ZEXT1664(auVar2);
                          auVar266 = ZEXT1664(local_9e0._0_16_);
                          auVar269 = ZEXT1664(auVar197);
                          auVar271 = ZEXT1664(auVar271._0_16_);
                          auVar276 = ZEXT1664(auVar276._0_16_);
                          auVar299 = ZEXT1664(auVar3);
                          (*((Geometry *)auVar95)->intersectionFilterN)(&local_a50);
                          auVar257 = ZEXT1664(ZEXT416((uint)fVar131));
                          auVar213 = ZEXT1664(ZEXT416((uint)fVar163));
                          auVar95 = local_ac0;
                        }
                        auVar72._8_8_ = uStack_af8;
                        auVar72._0_8_ = local_b00;
                        if (auVar72 == (undefined1  [16])0x0) {
                          auVar197 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar197 = auVar197 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar95)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar243 = ZEXT1664(auVar243._0_16_);
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar269 = ZEXT1664(auVar269._0_16_);
                            auVar271 = ZEXT1664(auVar271._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            auVar299 = ZEXT1664(auVar299._0_16_);
                            (*p_Var11)(&local_a50);
                            auVar257 = ZEXT1664(ZEXT416((uint)fVar131));
                            auVar213 = ZEXT1664(ZEXT416((uint)fVar163));
                          }
                          auVar73._8_8_ = uStack_af8;
                          auVar73._0_8_ = local_b00;
                          auVar173 = vpcmpeqd_avx(auVar73,_DAT_01feba10);
                          auVar216 = vpcmpeqd_avx(auVar216,auVar216);
                          auVar197 = auVar173 ^ auVar216;
                          if (auVar73 != (undefined1  [16])0x0) {
                            auVar173 = auVar173 ^ auVar216;
                            auVar216 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])local_a50.hit);
                            *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar216;
                            auVar216 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x10));
                            *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar216;
                            auVar216 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x20));
                            *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar216;
                            auVar216 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x30));
                            *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar216;
                            auVar216 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x40));
                            *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar216;
                            auVar216 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x50));
                            *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar216;
                            auVar216 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x60));
                            *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar216;
                            auVar216 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x70));
                            *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar216;
                            auVar216 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x80));
                            *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar216;
                          }
                        }
                        auVar152._8_8_ = 0x100000001;
                        auVar152._0_8_ = 0x100000001;
                        if ((auVar152 & auVar197) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar101;
                        }
                      }
                    }
                  }
                }
                auVar153 = local_5a0;
                bVar99 = lVar94 != 0;
                lVar94 = lVar94 + -1;
              } while ((!bVar47) && (bVar99));
              uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar123._4_4_ = uVar97;
              auVar123._0_4_ = uVar97;
              auVar123._8_4_ = uVar97;
              auVar123._12_4_ = uVar97;
              auVar123._16_4_ = uVar97;
              auVar123._20_4_ = uVar97;
              auVar123._24_4_ = uVar97;
              auVar123._28_4_ = uVar97;
              auVar111 = vcmpps_avx(_local_7c0,auVar123,2);
              local_5a0 = vandps_avx(auVar111,local_5a0);
              auVar153 = auVar153 & auVar111;
              uVar98 = local_5c0._0_8_;
            } while ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar153 >> 0x7f,0) != '\0') ||
                       (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar153 >> 0xbf,0) != '\0') ||
                     (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar153[0x1f] < '\0');
          }
          auVar162._0_4_ = (float)local_7a0._0_4_ + local_440._0_4_;
          auVar162._4_4_ = (float)local_7a0._4_4_ + local_440._4_4_;
          auVar162._8_4_ = fStack_798 + local_440._8_4_;
          auVar162._12_4_ = fStack_794 + local_440._12_4_;
          auVar162._16_4_ = fStack_790 + local_440._16_4_;
          auVar162._20_4_ = fStack_78c + local_440._20_4_;
          auVar162._24_4_ = fStack_788 + local_440._24_4_;
          auVar162._28_4_ = fStack_784 + local_440._28_4_;
          uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar212._4_4_ = uVar97;
          auVar212._0_4_ = uVar97;
          auVar212._8_4_ = uVar97;
          auVar212._12_4_ = uVar97;
          auVar212._16_4_ = uVar97;
          auVar212._20_4_ = uVar97;
          auVar212._24_4_ = uVar97;
          auVar212._28_4_ = uVar97;
          auVar111 = vcmpps_avx(auVar162,auVar212,2);
          auVar153 = vandps_avx(local_520,local_500);
          auVar153 = vandps_avx(auVar111,auVar153);
          auVar224._0_4_ = (float)local_7a0._0_4_ + local_400._0_4_;
          auVar224._4_4_ = (float)local_7a0._4_4_ + local_400._4_4_;
          auVar224._8_4_ = fStack_798 + local_400._8_4_;
          auVar224._12_4_ = fStack_794 + local_400._12_4_;
          auVar224._16_4_ = fStack_790 + local_400._16_4_;
          auVar224._20_4_ = fStack_78c + local_400._20_4_;
          auVar224._24_4_ = fStack_788 + local_400._24_4_;
          auVar224._28_4_ = fStack_784 + local_400._28_4_;
          auVar114 = vcmpps_avx(auVar224,auVar212,2);
          auVar111 = vandps_avx(local_860,_local_800);
          auVar111 = vandps_avx(auVar114,auVar111);
          auVar111 = vorps_avx(auVar153,auVar111);
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar111;
            auVar153 = vblendvps_avx(_local_400,local_440,auVar153);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar153;
            auVar75._8_8_ = uStack_888;
            auVar75._0_8_ = local_890;
            uVar169 = vmovlps_avx(auVar75);
            *(undefined8 *)(afStack_140 + uVar91 * 0x18) = uVar169;
            auStack_138[uVar91 * 0x18] = (int)uVar98 + 1;
            uVar91 = (ulong)((int)uVar91 + 1);
          }
        }
        goto LAB_0198139f;
      }
    }
    do {
      if ((int)uVar91 == 0) {
        uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar125._4_4_ = uVar97;
        auVar125._0_4_ = uVar97;
        auVar125._8_4_ = uVar97;
        auVar125._12_4_ = uVar97;
        auVar125._16_4_ = uVar97;
        auVar125._20_4_ = uVar97;
        auVar125._24_4_ = uVar97;
        auVar125._28_4_ = uVar97;
        auVar153 = vcmpps_avx(local_3c0,auVar125,2);
        uVar89 = vmovmskps_avx(auVar153);
        uVar89 = uVar89 & (uint)local_868 - 1 & (uint)local_868;
        if (uVar89 == 0) {
          return;
        }
        goto LAB_019809d3;
      }
      uVar93 = (ulong)((int)uVar91 - 1);
      lVar94 = uVar93 * 0x60;
      auVar153 = *(undefined1 (*) [32])(auStack_160 + lVar94);
      auVar120._0_4_ = auVar153._0_4_ + (float)local_7a0._0_4_;
      auVar120._4_4_ = auVar153._4_4_ + (float)local_7a0._4_4_;
      auVar120._8_4_ = auVar153._8_4_ + fStack_798;
      auVar120._12_4_ = auVar153._12_4_ + fStack_794;
      auVar120._16_4_ = auVar153._16_4_ + fStack_790;
      auVar120._20_4_ = auVar153._20_4_ + fStack_78c;
      auVar120._24_4_ = auVar153._24_4_ + fStack_788;
      auVar120._28_4_ = auVar153._28_4_ + fStack_784;
      uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar209._4_4_ = uVar97;
      auVar209._0_4_ = uVar97;
      auVar209._8_4_ = uVar97;
      auVar209._12_4_ = uVar97;
      auVar209._16_4_ = uVar97;
      auVar209._20_4_ = uVar97;
      auVar209._24_4_ = uVar97;
      auVar209._28_4_ = uVar97;
      auVar114 = vcmpps_avx(auVar120,auVar209,2);
      auVar111 = vandps_avx(auVar114,*(undefined1 (*) [32])(auStack_180 + lVar94));
      _local_6c0 = auVar111;
      auVar180 = *(undefined1 (*) [32])(auStack_180 + lVar94) & auVar114;
      bVar68 = (auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar69 = (auVar180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar67 = (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar66 = SUB321(auVar180 >> 0x7f,0) == '\0';
      bVar65 = (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar64 = SUB321(auVar180 >> 0xbf,0) == '\0';
      bVar99 = (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar47 = -1 < auVar180[0x1f];
      if (((((((!bVar68 || !bVar69) || !bVar67) || !bVar66) || !bVar65) || !bVar64) || !bVar99) ||
          !bVar47) {
        auVar178._8_4_ = 0x7f800000;
        auVar178._0_8_ = 0x7f8000007f800000;
        auVar178._12_4_ = 0x7f800000;
        auVar178._16_4_ = 0x7f800000;
        auVar178._20_4_ = 0x7f800000;
        auVar178._24_4_ = 0x7f800000;
        auVar178._28_4_ = 0x7f800000;
        auVar153 = vblendvps_avx(auVar178,auVar153,auVar111);
        auVar114 = vshufps_avx(auVar153,auVar153,0xb1);
        auVar114 = vminps_avx(auVar153,auVar114);
        auVar180 = vshufpd_avx(auVar114,auVar114,5);
        auVar180 = vminps_avx(auVar114,auVar180);
        auVar114 = vpermpd_avx2(auVar180,0x4e);
        auVar180 = vminps_avx(auVar180,auVar114);
        auVar153 = vcmpps_avx(auVar153,auVar180,0);
        auVar180 = auVar111 & auVar153;
        if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar180 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar180 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar180 >> 0x7f,0) != '\0') ||
              (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar180 >> 0xbf,0) != '\0') ||
            (auVar180 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar180[0x1f] < '\0') {
          auVar111 = vandps_avx(auVar153,auVar111);
        }
        fVar131 = afStack_140[uVar93 * 0x18 + 1];
        uVar98 = (ulong)auStack_138[uVar93 * 0x18];
        uVar96 = vmovmskps_avx(auVar111);
        iVar17 = 0;
        for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
          iVar17 = iVar17 + 1;
        }
        fVar101 = afStack_140[uVar93 * 0x18];
        auVar121._4_4_ = fVar101;
        auVar121._0_4_ = fVar101;
        auVar121._8_4_ = fVar101;
        auVar121._12_4_ = fVar101;
        auVar121._16_4_ = fVar101;
        auVar121._20_4_ = fVar101;
        auVar121._24_4_ = fVar101;
        auVar121._28_4_ = fVar101;
        *(undefined4 *)(local_6c0 + (uint)(iVar17 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar94) = _local_6c0;
        if ((((((((_local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6c0 >> 0x7f,0) != '\0') ||
              (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6c0 >> 0xbf,0) != '\0') ||
            (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6c0[0x1f] < '\0') {
          uVar93 = uVar91;
        }
        fVar131 = fVar131 - fVar101;
        auVar154._4_4_ = fVar131;
        auVar154._0_4_ = fVar131;
        auVar154._8_4_ = fVar131;
        auVar154._12_4_ = fVar131;
        auVar154._16_4_ = fVar131;
        auVar154._20_4_ = fVar131;
        auVar154._24_4_ = fVar131;
        auVar154._28_4_ = fVar131;
        auVar197 = vfmadd132ps_fma(auVar154,auVar121,_DAT_02020f20);
        local_440 = ZEXT1632(auVar197);
        local_890 = *(undefined8 *)(local_440 + (uint)(iVar17 << 2));
        uStack_888 = 0;
      }
      uVar91 = uVar93;
      auVar213 = ZEXT3264(auVar114);
    } while (((((((bVar68 && bVar69) && bVar67) && bVar66) && bVar65) && bVar64) && bVar99) &&
             bVar47);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }